

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<8,16>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  void *pvVar10;
  __int_type_conflict _Var11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  bool bVar24;
  byte bVar25;
  uint uVar26;
  ulong uVar27;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  ulong uVar32;
  undefined8 in_R10;
  ulong uVar33;
  ulong uVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar51 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar52 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar90 [64];
  undefined1 auVar92 [64];
  undefined1 auVar57 [16];
  undefined1 auVar94 [64];
  undefined1 auVar96 [64];
  undefined1 auVar98 [64];
  undefined1 auVar100 [64];
  float fVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar106 [64];
  float t1;
  undefined4 uVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar133;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar131;
  float fVar132;
  undefined1 in_ZMM4 [64];
  vfloat4 b0;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  vfloat4 b0_1;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  vfloat4 a0_3;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  vfloat4 a0_2;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar177 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar205;
  float fVar207;
  float fVar209;
  undefined1 auVar196 [16];
  float fVar206;
  float fVar208;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar210;
  float fVar219;
  float fVar220;
  vfloat4 a0_1;
  undefined1 auVar211 [16];
  float fVar221;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  vfloat4 a0;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  uint auStack_630 [4];
  RTCFilterFunctionNArguments local_620;
  undefined1 local_5f0 [8];
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [8];
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [16];
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined1 local_400 [64];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar28;
  undefined1 auVar89 [64];
  undefined1 auVar91 [64];
  undefined1 auVar93 [64];
  undefined1 auVar95 [64];
  undefined1 auVar97 [64];
  undefined1 auVar99 [64];
  undefined1 auVar229 [32];
  
  uVar27 = (ulong)(byte)prim[1];
  fVar193 = *(float *)(prim + uVar27 * 0x19 + 0x12);
  auVar40 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar40 = vinsertps_avx(auVar40,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar50 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar42 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar52 = vsubps_avx(auVar40,*(undefined1 (*) [16])(prim + uVar27 * 0x19 + 6));
  fVar119 = fVar193 * auVar52._0_4_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar27 * 4 + 6);
  auVar74 = vpmovsxbd_avx2(auVar40);
  fVar101 = fVar193 * auVar42._0_4_;
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar27 * 5 + 6);
  auVar72 = vpmovsxbd_avx2(auVar50);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar27 * 6 + 6);
  auVar75 = vpmovsxbd_avx2(auVar3);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar27 * 0xb + 6);
  auVar82 = vpmovsxbd_avx2(auVar49);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar27 * 0xc + 6);
  auVar83 = vpmovsxbd_avx2(auVar48);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar27 * 0xd + 6);
  auVar73 = vpmovsxbd_avx2(auVar47);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar27 * 0x12 + 6);
  auVar76 = vpmovsxbd_avx2(auVar4);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar27 * 0x13 + 6);
  auVar77 = vpmovsxbd_avx2(auVar46);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar27 * 0x14 + 6);
  auVar70 = vpmovsxbd_avx2(auVar5);
  auVar78 = vcvtdq2ps_avx(auVar70);
  auVar66 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar241 = ZEXT3264(auVar66);
  auVar129._4_4_ = fVar101;
  auVar129._0_4_ = fVar101;
  auVar129._8_4_ = fVar101;
  auVar129._12_4_ = fVar101;
  auVar129._16_4_ = fVar101;
  auVar129._20_4_ = fVar101;
  auVar129._24_4_ = fVar101;
  auVar129._28_4_ = fVar101;
  auVar71 = ZEXT1632(CONCAT412(fVar193 * auVar42._12_4_,
                               CONCAT48(fVar193 * auVar42._8_4_,
                                        CONCAT44(fVar193 * auVar42._4_4_,fVar101))));
  auVar67 = vpermps_avx512vl(auVar66,auVar71);
  auVar68 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar242 = ZEXT3264(auVar68);
  auVar69 = vpermps_avx512vl(auVar68,auVar71);
  fVar101 = auVar69._0_4_;
  auVar106._0_4_ = fVar101 * auVar75._0_4_;
  fVar195 = auVar69._4_4_;
  auVar106._4_4_ = fVar195 * auVar75._4_4_;
  fVar206 = auVar69._8_4_;
  auVar106._8_4_ = fVar206 * auVar75._8_4_;
  fVar208 = auVar69._12_4_;
  auVar106._12_4_ = fVar208 * auVar75._12_4_;
  fVar107 = auVar69._16_4_;
  auVar106._16_4_ = fVar107 * auVar75._16_4_;
  fVar108 = auVar69._20_4_;
  auVar106._20_4_ = fVar108 * auVar75._20_4_;
  fVar109 = auVar69._24_4_;
  auVar106._28_36_ = in_ZMM4._28_36_;
  auVar106._24_4_ = fVar109 * auVar75._24_4_;
  auVar71._4_4_ = auVar73._4_4_ * fVar195;
  auVar71._0_4_ = auVar73._0_4_ * fVar101;
  auVar71._8_4_ = auVar73._8_4_ * fVar206;
  auVar71._12_4_ = auVar73._12_4_ * fVar208;
  auVar71._16_4_ = auVar73._16_4_ * fVar107;
  auVar71._20_4_ = auVar73._20_4_ * fVar108;
  auVar71._24_4_ = auVar73._24_4_ * fVar109;
  auVar71._28_4_ = auVar70._28_4_;
  auVar70._4_4_ = fVar195 * auVar78._4_4_;
  auVar70._0_4_ = fVar101 * auVar78._0_4_;
  auVar70._8_4_ = fVar206 * auVar78._8_4_;
  auVar70._12_4_ = fVar208 * auVar78._12_4_;
  auVar70._16_4_ = fVar107 * auVar78._16_4_;
  auVar70._20_4_ = fVar108 * auVar78._20_4_;
  auVar70._24_4_ = fVar109 * auVar78._24_4_;
  auVar70._28_4_ = auVar69._28_4_;
  auVar40 = vfmadd231ps_fma(auVar106._0_32_,auVar67,auVar72);
  auVar50 = vfmadd231ps_fma(auVar71,auVar67,auVar83);
  auVar3 = vfmadd231ps_fma(auVar70,auVar77,auVar67);
  auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar129,auVar74);
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar129,auVar82);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar76,auVar129);
  auVar141._4_4_ = fVar119;
  auVar141._0_4_ = fVar119;
  auVar141._8_4_ = fVar119;
  auVar141._12_4_ = fVar119;
  auVar141._16_4_ = fVar119;
  auVar141._20_4_ = fVar119;
  auVar141._24_4_ = fVar119;
  auVar141._28_4_ = fVar119;
  auVar71 = ZEXT1632(CONCAT412(fVar193 * auVar52._12_4_,
                               CONCAT48(fVar193 * auVar52._8_4_,
                                        CONCAT44(fVar193 * auVar52._4_4_,fVar119))));
  auVar70 = vpermps_avx512vl(auVar66,auVar71);
  auVar71 = vpermps_avx512vl(auVar68,auVar71);
  fVar193 = auVar71._0_4_;
  fVar101 = auVar71._4_4_;
  auVar66._4_4_ = fVar101 * auVar75._4_4_;
  auVar66._0_4_ = fVar193 * auVar75._0_4_;
  fVar195 = auVar71._8_4_;
  auVar66._8_4_ = fVar195 * auVar75._8_4_;
  fVar206 = auVar71._12_4_;
  auVar66._12_4_ = fVar206 * auVar75._12_4_;
  fVar208 = auVar71._16_4_;
  auVar66._16_4_ = fVar208 * auVar75._16_4_;
  fVar107 = auVar71._20_4_;
  auVar66._20_4_ = fVar107 * auVar75._20_4_;
  fVar108 = auVar71._24_4_;
  auVar66._24_4_ = fVar108 * auVar75._24_4_;
  auVar66._28_4_ = auVar75._28_4_;
  auVar80._0_4_ = fVar193 * auVar73._0_4_;
  auVar80._4_4_ = fVar101 * auVar73._4_4_;
  auVar80._8_4_ = fVar195 * auVar73._8_4_;
  auVar80._12_4_ = fVar206 * auVar73._12_4_;
  auVar80._16_4_ = fVar208 * auVar73._16_4_;
  auVar80._20_4_ = fVar107 * auVar73._20_4_;
  auVar80._24_4_ = fVar108 * auVar73._24_4_;
  auVar80._28_4_ = 0;
  auVar73._4_4_ = fVar101 * auVar78._4_4_;
  auVar73._0_4_ = fVar193 * auVar78._0_4_;
  auVar73._8_4_ = fVar195 * auVar78._8_4_;
  auVar73._12_4_ = fVar206 * auVar78._12_4_;
  auVar73._16_4_ = fVar208 * auVar78._16_4_;
  auVar73._20_4_ = fVar107 * auVar78._20_4_;
  auVar73._24_4_ = fVar108 * auVar78._24_4_;
  auVar73._28_4_ = auVar78._28_4_;
  auVar49 = vfmadd231ps_fma(auVar66,auVar70,auVar72);
  auVar48 = vfmadd231ps_fma(auVar80,auVar70,auVar83);
  auVar47 = vfmadd231ps_fma(auVar73,auVar70,auVar77);
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar141,auVar74);
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar141,auVar82);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar141,auVar76);
  auVar84._8_4_ = 0x7fffffff;
  auVar84._0_8_ = 0x7fffffff7fffffff;
  auVar84._12_4_ = 0x7fffffff;
  auVar84._16_4_ = 0x7fffffff;
  auVar84._20_4_ = 0x7fffffff;
  auVar84._24_4_ = 0x7fffffff;
  auVar84._28_4_ = 0x7fffffff;
  auVar85._8_4_ = 0x219392ef;
  auVar85._0_8_ = 0x219392ef219392ef;
  auVar85._12_4_ = 0x219392ef;
  auVar85._16_4_ = 0x219392ef;
  auVar85._20_4_ = 0x219392ef;
  auVar85._24_4_ = 0x219392ef;
  auVar85._28_4_ = 0x219392ef;
  auVar74 = vandps_avx(ZEXT1632(auVar40),auVar84);
  uVar33 = vcmpps_avx512vl(auVar74,auVar85,1);
  bVar35 = (bool)((byte)uVar33 & 1);
  auVar67._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar40._0_4_;
  bVar35 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar67._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar40._4_4_;
  bVar35 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar67._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar40._8_4_;
  bVar35 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar67._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar40._12_4_;
  auVar67._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar67._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar67._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar67._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar74 = vandps_avx(ZEXT1632(auVar50),auVar84);
  uVar33 = vcmpps_avx512vl(auVar74,auVar85,1);
  bVar35 = (bool)((byte)uVar33 & 1);
  auVar68._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar50._0_4_;
  bVar35 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar68._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar50._4_4_;
  bVar35 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar68._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar50._8_4_;
  bVar35 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar68._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar50._12_4_;
  auVar68._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar68._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar68._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar68._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar74 = vandps_avx(ZEXT1632(auVar3),auVar84);
  uVar33 = vcmpps_avx512vl(auVar74,auVar85,1);
  bVar35 = (bool)((byte)uVar33 & 1);
  auVar74._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar3._0_4_;
  bVar35 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar3._4_4_;
  bVar35 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar3._8_4_;
  bVar35 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar3._12_4_;
  auVar74._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar74._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar74._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar74._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar72 = vrcp14ps_avx512vl(auVar67);
  auVar86._8_4_ = 0x3f800000;
  auVar86._0_8_ = 0x3f8000003f800000;
  auVar86._12_4_ = 0x3f800000;
  auVar86._16_4_ = 0x3f800000;
  auVar86._20_4_ = 0x3f800000;
  auVar86._24_4_ = 0x3f800000;
  auVar86._28_4_ = 0x3f800000;
  auVar40 = vfnmadd213ps_fma(auVar67,auVar72,auVar86);
  auVar40 = vfmadd132ps_fma(ZEXT1632(auVar40),auVar72,auVar72);
  auVar72 = vrcp14ps_avx512vl(auVar68);
  auVar50 = vfnmadd213ps_fma(auVar68,auVar72,auVar86);
  auVar50 = vfmadd132ps_fma(ZEXT1632(auVar50),auVar72,auVar72);
  auVar72 = vrcp14ps_avx512vl(auVar74);
  auVar3 = vfnmadd213ps_fma(auVar74,auVar72,auVar86);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar72,auVar72);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar27 * 7 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar49));
  auVar76._4_4_ = auVar40._4_4_ * auVar74._4_4_;
  auVar76._0_4_ = auVar40._0_4_ * auVar74._0_4_;
  auVar76._8_4_ = auVar40._8_4_ * auVar74._8_4_;
  auVar76._12_4_ = auVar40._12_4_ * auVar74._12_4_;
  auVar76._16_4_ = auVar74._16_4_ * 0.0;
  auVar76._20_4_ = auVar74._20_4_ * 0.0;
  auVar76._24_4_ = auVar74._24_4_ * 0.0;
  auVar76._28_4_ = auVar74._28_4_;
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar27 * 9 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar49));
  auVar81._0_4_ = auVar40._0_4_ * auVar74._0_4_;
  auVar81._4_4_ = auVar40._4_4_ * auVar74._4_4_;
  auVar81._8_4_ = auVar40._8_4_ * auVar74._8_4_;
  auVar81._12_4_ = auVar40._12_4_ * auVar74._12_4_;
  auVar81._16_4_ = auVar74._16_4_ * 0.0;
  auVar81._20_4_ = auVar74._20_4_ * 0.0;
  auVar81._24_4_ = auVar74._24_4_ * 0.0;
  auVar81._28_4_ = 0;
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar27 * 0xe + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar48));
  auVar77._4_4_ = auVar50._4_4_ * auVar74._4_4_;
  auVar77._0_4_ = auVar50._0_4_ * auVar74._0_4_;
  auVar77._8_4_ = auVar50._8_4_ * auVar74._8_4_;
  auVar77._12_4_ = auVar50._12_4_ * auVar74._12_4_;
  auVar77._16_4_ = auVar74._16_4_ * 0.0;
  auVar77._20_4_ = auVar74._20_4_ * 0.0;
  auVar77._24_4_ = auVar74._24_4_ * 0.0;
  auVar77._28_4_ = auVar74._28_4_;
  auVar73 = vpbroadcastd_avx512vl();
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar48));
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar27 * 0x15 + 6));
  auVar79._0_4_ = auVar50._0_4_ * auVar74._0_4_;
  auVar79._4_4_ = auVar50._4_4_ * auVar74._4_4_;
  auVar79._8_4_ = auVar50._8_4_ * auVar74._8_4_;
  auVar79._12_4_ = auVar50._12_4_ * auVar74._12_4_;
  auVar79._16_4_ = auVar74._16_4_ * 0.0;
  auVar79._20_4_ = auVar74._20_4_ * 0.0;
  auVar79._24_4_ = auVar74._24_4_ * 0.0;
  auVar79._28_4_ = 0;
  auVar74 = vcvtdq2ps_avx(auVar72);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar47));
  auVar78._4_4_ = auVar74._4_4_ * auVar3._4_4_;
  auVar78._0_4_ = auVar74._0_4_ * auVar3._0_4_;
  auVar78._8_4_ = auVar74._8_4_ * auVar3._8_4_;
  auVar78._12_4_ = auVar74._12_4_ * auVar3._12_4_;
  auVar78._16_4_ = auVar74._16_4_ * 0.0;
  auVar78._20_4_ = auVar74._20_4_ * 0.0;
  auVar78._24_4_ = auVar74._24_4_ * 0.0;
  auVar78._28_4_ = auVar74._28_4_;
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar27 * 0x17 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar47));
  auVar69._0_4_ = auVar3._0_4_ * auVar74._0_4_;
  auVar69._4_4_ = auVar3._4_4_ * auVar74._4_4_;
  auVar69._8_4_ = auVar3._8_4_ * auVar74._8_4_;
  auVar69._12_4_ = auVar3._12_4_ * auVar74._12_4_;
  auVar69._16_4_ = auVar74._16_4_ * 0.0;
  auVar69._20_4_ = auVar74._20_4_ * 0.0;
  auVar69._24_4_ = auVar74._24_4_ * 0.0;
  auVar69._28_4_ = 0;
  auVar74 = vpminsd_avx2(auVar76,auVar81);
  auVar72 = vpminsd_avx2(auVar77,auVar79);
  auVar74 = vmaxps_avx(auVar74,auVar72);
  auVar72 = vpminsd_avx2(auVar78,auVar69);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar75._4_4_ = uVar110;
  auVar75._0_4_ = uVar110;
  auVar75._8_4_ = uVar110;
  auVar75._12_4_ = uVar110;
  auVar75._16_4_ = uVar110;
  auVar75._20_4_ = uVar110;
  auVar75._24_4_ = uVar110;
  auVar75._28_4_ = uVar110;
  auVar72 = vmaxps_avx512vl(auVar72,auVar75);
  auVar74 = vmaxps_avx(auVar74,auVar72);
  auVar72._8_4_ = 0x3f7ffffa;
  auVar72._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar72._12_4_ = 0x3f7ffffa;
  auVar72._16_4_ = 0x3f7ffffa;
  auVar72._20_4_ = 0x3f7ffffa;
  auVar72._24_4_ = 0x3f7ffffa;
  auVar72._28_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar74,auVar72);
  auVar74 = vpmaxsd_avx2(auVar76,auVar81);
  auVar72 = vpmaxsd_avx2(auVar77,auVar79);
  auVar74 = vminps_avx(auVar74,auVar72);
  auVar72 = vpmaxsd_avx2(auVar78,auVar69);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar82._4_4_ = uVar110;
  auVar82._0_4_ = uVar110;
  auVar82._8_4_ = uVar110;
  auVar82._12_4_ = uVar110;
  auVar82._16_4_ = uVar110;
  auVar82._20_4_ = uVar110;
  auVar82._24_4_ = uVar110;
  auVar82._28_4_ = uVar110;
  auVar72 = vminps_avx512vl(auVar72,auVar82);
  auVar74 = vminps_avx(auVar74,auVar72);
  auVar83._8_4_ = 0x3f800003;
  auVar83._0_8_ = 0x3f8000033f800003;
  auVar83._12_4_ = 0x3f800003;
  auVar83._16_4_ = 0x3f800003;
  auVar83._20_4_ = 0x3f800003;
  auVar83._24_4_ = 0x3f800003;
  auVar83._28_4_ = 0x3f800003;
  auVar74 = vmulps_avx512vl(auVar74,auVar83);
  uVar12 = vcmpps_avx512vl(local_3c0,auVar74,2);
  uVar13 = vpcmpgtd_avx512vl(auVar73,_DAT_01fb4ba0);
  uVar33 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar12 & (byte)uVar13));
  auVar106 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar106);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar106 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar235 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar236 = ZEXT1664(auVar40);
  auVar245 = ZEXT464(0x3f800000);
LAB_01a0143e:
  if (uVar33 == 0) {
LAB_01a02ff4:
    return uVar33 != 0;
  }
  lVar29 = 0;
  for (uVar27 = uVar33; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
    lVar29 = lVar29 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  uVar27 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar29 * 4 + 6));
  p_Var9 = pGVar8[1].intersectionFilterN;
  pvVar10 = pGVar8[2].userPtr;
  _Var11 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar40 = *(undefined1 (*) [16])(_Var11 + uVar27 * (long)pvVar10);
  auVar50 = *(undefined1 (*) [16])(_Var11 + (uVar27 + 1) * (long)pvVar10);
  auVar3 = *(undefined1 (*) [16])(_Var11 + (uVar27 + 2) * (long)pvVar10);
  auVar49 = *(undefined1 (*) [16])(_Var11 + (long)pvVar10 * (uVar27 + 3));
  lVar29 = *(long *)&pGVar8[1].time_range.upper;
  auVar48 = *(undefined1 (*) [16])(lVar29 + (long)p_Var9 * uVar27);
  auVar47 = *(undefined1 (*) [16])(lVar29 + (long)p_Var9 * (uVar27 + 1));
  auVar4 = *(undefined1 (*) [16])(lVar29 + (long)p_Var9 * (uVar27 + 2));
  uVar34 = uVar33 - 1 & uVar33;
  auVar46 = *(undefined1 (*) [16])(lVar29 + (long)p_Var9 * (uVar27 + 3));
  if (uVar34 != 0) {
    uVar32 = uVar34 - 1 & uVar34;
    for (uVar27 = uVar34; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
    }
    if (uVar32 != 0) {
      for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar51 = ZEXT816(0) << 0x40;
  auVar44._0_4_ = auVar46._0_4_ * 0.0;
  auVar44._4_4_ = auVar46._4_4_ * 0.0;
  auVar44._8_4_ = auVar46._8_4_ * 0.0;
  auVar44._12_4_ = auVar46._12_4_ * 0.0;
  auVar225._8_4_ = 0x3e2aaaab;
  auVar225._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar225._12_4_ = 0x3e2aaaab;
  auVar42 = vfmadd213ps_fma(auVar225,auVar4,auVar44);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar47,auVar41);
  auVar52 = vfmadd231ps_fma(auVar42,auVar48,auVar225);
  auVar61 = auVar106._0_16_;
  auVar42 = vfmadd231ps_avx512vl(auVar44,auVar4,auVar61);
  auVar42 = vfnmadd231ps_fma(auVar42,auVar47,auVar51);
  auVar43 = vfnmadd231ps_avx512vl(auVar42,auVar48,auVar61);
  auVar211._0_4_ = auVar49._0_4_ * 0.0;
  auVar211._4_4_ = auVar49._4_4_ * 0.0;
  auVar211._8_4_ = auVar49._8_4_ * 0.0;
  auVar211._12_4_ = auVar49._12_4_ * 0.0;
  auVar42 = vfmadd213ps_fma(auVar225,auVar3,auVar211);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar50,auVar41);
  auVar42 = vfmadd231ps_fma(auVar42,auVar40,auVar225);
  auVar44 = vfmadd231ps_avx512vl(auVar211,auVar3,auVar61);
  auVar44 = vfnmadd231ps_fma(auVar44,auVar50,auVar51);
  auVar45 = vfnmadd231ps_avx512vl(auVar44,auVar40,auVar61);
  auVar55._0_4_ = auVar46._0_4_ * 0.16666667;
  auVar55._4_4_ = auVar46._4_4_ * 0.16666667;
  auVar55._8_4_ = auVar46._8_4_ * 0.16666667;
  auVar55._12_4_ = auVar46._12_4_ * 0.16666667;
  auVar44 = vfmadd231ps_avx512vl(auVar55,auVar4,auVar41);
  auVar44 = vfmadd231ps_fma(auVar44,auVar47,auVar225);
  auVar44 = vfmadd231ps_fma(auVar44,auVar48,auVar51);
  auVar46 = vmulps_avx512vl(auVar46,auVar61);
  auVar4 = vfmadd231ps_fma(auVar46,auVar51,auVar4);
  auVar47 = vfnmadd231ps_avx512vl(auVar4,auVar61,auVar47);
  auVar4 = vfnmadd231ps_fma(auVar47,auVar51,auVar48);
  auVar173._0_4_ = auVar49._0_4_ * 0.16666667;
  auVar173._4_4_ = auVar49._4_4_ * 0.16666667;
  auVar173._8_4_ = auVar49._8_4_ * 0.16666667;
  auVar173._12_4_ = auVar49._12_4_ * 0.16666667;
  auVar48 = vfmadd231ps_avx512vl(auVar173,auVar3,auVar41);
  auVar48 = vfmadd231ps_fma(auVar48,auVar50,auVar225);
  auVar48 = vfmadd231ps_fma(auVar48,auVar40,auVar51);
  auVar49 = vmulps_avx512vl(auVar49,auVar61);
  auVar3 = vfmadd231ps_fma(auVar49,auVar51,auVar3);
  auVar50 = vfnmadd231ps_avx512vl(auVar3,auVar61,auVar50);
  auVar47 = vfnmadd231ps_fma(auVar50,auVar51,auVar40);
  auVar40 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar50 = vshufps_avx(auVar42,auVar42,0xc9);
  fVar208 = auVar43._0_4_;
  auVar54._0_4_ = fVar208 * auVar50._0_4_;
  fVar107 = auVar43._4_4_;
  auVar54._4_4_ = fVar107 * auVar50._4_4_;
  fVar108 = auVar43._8_4_;
  auVar54._8_4_ = fVar108 * auVar50._8_4_;
  fVar109 = auVar43._12_4_;
  auVar54._12_4_ = fVar109 * auVar50._12_4_;
  auVar50 = vfmsub231ps_fma(auVar54,auVar40,auVar42);
  auVar3 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar50 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar60._0_4_ = fVar208 * auVar50._0_4_;
  auVar60._4_4_ = fVar107 * auVar50._4_4_;
  auVar60._8_4_ = fVar108 * auVar50._8_4_;
  auVar60._12_4_ = fVar109 * auVar50._12_4_;
  auVar40 = vfmsub231ps_fma(auVar60,auVar40,auVar45);
  auVar49 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vshufps_avx(auVar4,auVar4,0xc9);
  auVar50 = vshufps_avx(auVar48,auVar48,0xc9);
  fVar119 = auVar4._0_4_;
  auVar64._0_4_ = fVar119 * auVar50._0_4_;
  fVar131 = auVar4._4_4_;
  auVar64._4_4_ = fVar131 * auVar50._4_4_;
  fVar132 = auVar4._8_4_;
  auVar64._8_4_ = fVar132 * auVar50._8_4_;
  fVar133 = auVar4._12_4_;
  auVar64._12_4_ = fVar133 * auVar50._12_4_;
  auVar50 = vfmsub231ps_fma(auVar64,auVar40,auVar48);
  auVar48 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar50 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar174._0_4_ = auVar50._0_4_ * fVar119;
  auVar174._4_4_ = auVar50._4_4_ * fVar131;
  auVar174._8_4_ = auVar50._8_4_ * fVar132;
  auVar174._12_4_ = auVar50._12_4_ * fVar133;
  auVar40 = vfmsub231ps_fma(auVar174,auVar40,auVar47);
  auVar47 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vdpps_avx(auVar3,auVar3,0x7f);
  fVar101 = auVar40._0_4_;
  auVar175._4_12_ = ZEXT812(0) << 0x20;
  auVar175._0_4_ = fVar101;
  auVar50 = vrsqrt14ss_avx512f(auVar51,auVar175);
  auVar46 = vmulss_avx512f(auVar50,ZEXT416(0x3fc00000));
  auVar42 = vmulss_avx512f(auVar40,ZEXT416(0xbf000000));
  fVar193 = auVar50._0_4_;
  fVar193 = auVar46._0_4_ + auVar42._0_4_ * fVar193 * fVar193 * fVar193;
  fVar210 = fVar193 * auVar3._0_4_;
  fVar219 = fVar193 * auVar3._4_4_;
  fVar220 = fVar193 * auVar3._8_4_;
  fVar221 = fVar193 * auVar3._12_4_;
  auVar50 = vdpps_avx(auVar3,auVar49,0x7f);
  auVar187._0_4_ = auVar49._0_4_ * fVar101;
  auVar187._4_4_ = auVar49._4_4_ * fVar101;
  auVar187._8_4_ = auVar49._8_4_ * fVar101;
  auVar187._12_4_ = auVar49._12_4_ * fVar101;
  fVar101 = auVar50._0_4_;
  auVar152._0_4_ = fVar101 * auVar3._0_4_;
  auVar152._4_4_ = fVar101 * auVar3._4_4_;
  auVar152._8_4_ = fVar101 * auVar3._8_4_;
  auVar152._12_4_ = fVar101 * auVar3._12_4_;
  auVar3 = vsubps_avx(auVar187,auVar152);
  auVar50 = vrcp14ss_avx512f(auVar51,auVar175);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar50,ZEXT416(0x40000000));
  fVar195 = auVar50._0_4_ * auVar40._0_4_;
  auVar40 = vdpps_avx(auVar48,auVar48,0x7f);
  fVar206 = auVar40._0_4_;
  auVar166._4_12_ = ZEXT812(0) << 0x20;
  auVar166._0_4_ = fVar206;
  auVar50 = vrsqrt14ss_avx512f(auVar51,auVar166);
  auVar49 = vmulss_avx512f(auVar50,ZEXT416(0x3fc00000));
  auVar46 = vmulss_avx512f(auVar40,ZEXT416(0xbf000000));
  fVar101 = auVar50._0_4_;
  fVar101 = auVar49._0_4_ + auVar46._0_4_ * fVar101 * fVar101 * fVar101;
  fVar194 = fVar101 * auVar48._0_4_;
  fVar205 = fVar101 * auVar48._4_4_;
  fVar207 = fVar101 * auVar48._8_4_;
  fVar209 = fVar101 * auVar48._12_4_;
  auVar50 = vdpps_avx(auVar48,auVar47,0x7f);
  auVar62._0_4_ = fVar206 * auVar47._0_4_;
  auVar62._4_4_ = fVar206 * auVar47._4_4_;
  auVar62._8_4_ = fVar206 * auVar47._8_4_;
  auVar62._12_4_ = fVar206 * auVar47._12_4_;
  fVar206 = auVar50._0_4_;
  auVar53._0_4_ = fVar206 * auVar48._0_4_;
  auVar53._4_4_ = fVar206 * auVar48._4_4_;
  auVar53._8_4_ = fVar206 * auVar48._8_4_;
  auVar53._12_4_ = fVar206 * auVar48._12_4_;
  auVar49 = vsubps_avx(auVar62,auVar53);
  auVar50 = vrcp14ss_avx512f(auVar51,auVar166);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar50,ZEXT416(0x40000000));
  fVar206 = auVar40._0_4_ * auVar50._0_4_;
  auVar40 = vshufps_avx(auVar52,auVar52,0xff);
  auVar167._0_4_ = fVar210 * auVar40._0_4_;
  auVar167._4_4_ = fVar219 * auVar40._4_4_;
  auVar167._8_4_ = fVar220 * auVar40._8_4_;
  auVar167._12_4_ = fVar221 * auVar40._12_4_;
  local_540 = vsubps_avx(auVar52,auVar167);
  auVar50 = vshufps_avx(auVar43,auVar43,0xff);
  auVar63._0_4_ = auVar50._0_4_ * fVar210 + auVar40._0_4_ * fVar193 * fVar195 * auVar3._0_4_;
  auVar63._4_4_ = auVar50._4_4_ * fVar219 + auVar40._4_4_ * fVar193 * fVar195 * auVar3._4_4_;
  auVar63._8_4_ = auVar50._8_4_ * fVar220 + auVar40._8_4_ * fVar193 * fVar195 * auVar3._8_4_;
  auVar63._12_4_ = auVar50._12_4_ * fVar221 + auVar40._12_4_ * fVar193 * fVar195 * auVar3._12_4_;
  auVar3 = vsubps_avx(auVar43,auVar63);
  local_550._0_4_ = auVar167._0_4_ + auVar52._0_4_;
  local_550._4_4_ = auVar167._4_4_ + auVar52._4_4_;
  fStack_548 = auVar167._8_4_ + auVar52._8_4_;
  fStack_544 = auVar167._12_4_ + auVar52._12_4_;
  auVar40 = vshufps_avx(auVar44,auVar44,0xff);
  auVar144._0_4_ = fVar194 * auVar40._0_4_;
  auVar144._4_4_ = fVar205 * auVar40._4_4_;
  auVar144._8_4_ = fVar207 * auVar40._8_4_;
  auVar144._12_4_ = fVar209 * auVar40._12_4_;
  local_560 = vsubps_avx(auVar44,auVar144);
  auVar50 = vshufps_avx(auVar4,auVar4,0xff);
  auVar45._0_4_ = auVar50._0_4_ * fVar194 + auVar40._0_4_ * fVar101 * auVar49._0_4_ * fVar206;
  auVar45._4_4_ = auVar50._4_4_ * fVar205 + auVar40._4_4_ * fVar101 * auVar49._4_4_ * fVar206;
  auVar45._8_4_ = auVar50._8_4_ * fVar207 + auVar40._8_4_ * fVar101 * auVar49._8_4_ * fVar206;
  auVar45._12_4_ = auVar50._12_4_ * fVar209 + auVar40._12_4_ * fVar101 * auVar49._12_4_ * fVar206;
  auVar40 = vsubps_avx(auVar4,auVar45);
  _local_570 = vaddps_avx512vl(auVar44,auVar144);
  auVar56._0_4_ = auVar3._0_4_ * 0.33333334;
  auVar56._4_4_ = auVar3._4_4_ * 0.33333334;
  auVar56._8_4_ = auVar3._8_4_ * 0.33333334;
  auVar56._12_4_ = auVar3._12_4_ * 0.33333334;
  local_580 = vaddps_avx512vl(local_540,auVar56);
  auVar59._0_4_ = auVar40._0_4_ * 0.33333334;
  auVar59._4_4_ = auVar40._4_4_ * 0.33333334;
  auVar59._8_4_ = auVar40._8_4_ * 0.33333334;
  auVar59._12_4_ = auVar40._12_4_ * 0.33333334;
  local_590 = vsubps_avx512vl(local_560,auVar59);
  auVar52._0_4_ = (fVar208 + auVar63._0_4_) * 0.33333334;
  auVar52._4_4_ = (fVar107 + auVar63._4_4_) * 0.33333334;
  auVar52._8_4_ = (fVar108 + auVar63._8_4_) * 0.33333334;
  auVar52._12_4_ = (fVar109 + auVar63._12_4_) * 0.33333334;
  _local_5a0 = vaddps_avx512vl(_local_550,auVar52);
  auVar41._0_4_ = (fVar119 + auVar45._0_4_) * 0.33333334;
  auVar41._4_4_ = (fVar131 + auVar45._4_4_) * 0.33333334;
  auVar41._8_4_ = (fVar132 + auVar45._8_4_) * 0.33333334;
  auVar41._12_4_ = (fVar133 + auVar45._12_4_) * 0.33333334;
  _local_5b0 = vsubps_avx512vl(_local_570,auVar41);
  local_4c0 = vsubps_avx(local_540,auVar5);
  uVar110 = local_4c0._0_4_;
  auVar61._4_4_ = uVar110;
  auVar61._0_4_ = uVar110;
  auVar61._8_4_ = uVar110;
  auVar61._12_4_ = uVar110;
  auVar40 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar50 = vshufps_avx(local_4c0,local_4c0,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar193 = pre->ray_space[k].vz.field_0.m128[0];
  fVar101 = pre->ray_space[k].vz.field_0.m128[1];
  fVar195 = pre->ray_space[k].vz.field_0.m128[2];
  fVar206 = pre->ray_space[k].vz.field_0.m128[3];
  auVar43._0_4_ = fVar193 * auVar50._0_4_;
  auVar43._4_4_ = fVar101 * auVar50._4_4_;
  auVar43._8_4_ = fVar195 * auVar50._8_4_;
  auVar43._12_4_ = fVar206 * auVar50._12_4_;
  auVar40 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar2,auVar40);
  auVar46 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar61);
  local_4d0 = vsubps_avx512vl(local_580,auVar5);
  uVar110 = local_4d0._0_4_;
  auVar57._4_4_ = uVar110;
  auVar57._0_4_ = uVar110;
  auVar57._8_4_ = uVar110;
  auVar57._12_4_ = uVar110;
  auVar40 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar50 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar65._0_4_ = fVar193 * auVar50._0_4_;
  auVar65._4_4_ = fVar101 * auVar50._4_4_;
  auVar65._8_4_ = fVar195 * auVar50._8_4_;
  auVar65._12_4_ = fVar206 * auVar50._12_4_;
  auVar40 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar2,auVar40);
  auVar42 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar57);
  local_4e0 = vsubps_avx512vl(local_590,auVar5);
  uVar110 = local_4e0._0_4_;
  auVar153._4_4_ = uVar110;
  auVar153._0_4_ = uVar110;
  auVar153._8_4_ = uVar110;
  auVar153._12_4_ = uVar110;
  auVar40 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar50 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar58._0_4_ = fVar193 * auVar50._0_4_;
  auVar58._4_4_ = fVar101 * auVar50._4_4_;
  auVar58._8_4_ = fVar195 * auVar50._8_4_;
  auVar58._12_4_ = fVar206 * auVar50._12_4_;
  auVar40 = vfmadd231ps_fma(auVar58,(undefined1  [16])aVar2,auVar40);
  auVar52 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar153);
  local_4f0 = vsubps_avx(local_560,auVar5);
  uVar110 = local_4f0._0_4_;
  auVar154._4_4_ = uVar110;
  auVar154._0_4_ = uVar110;
  auVar154._8_4_ = uVar110;
  auVar154._12_4_ = uVar110;
  auVar40 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar50 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar176._0_4_ = auVar50._0_4_ * fVar193;
  auVar176._4_4_ = auVar50._4_4_ * fVar101;
  auVar176._8_4_ = auVar50._8_4_ * fVar195;
  auVar176._12_4_ = auVar50._12_4_ * fVar206;
  auVar40 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar2,auVar40);
  auVar44 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar154);
  local_500 = vsubps_avx(_local_550,auVar5);
  uVar110 = local_500._0_4_;
  auVar155._4_4_ = uVar110;
  auVar155._0_4_ = uVar110;
  auVar155._8_4_ = uVar110;
  auVar155._12_4_ = uVar110;
  auVar40 = vshufps_avx(local_500,local_500,0x55);
  auVar50 = vshufps_avx(local_500,local_500,0xaa);
  auVar188._0_4_ = auVar50._0_4_ * fVar193;
  auVar188._4_4_ = auVar50._4_4_ * fVar101;
  auVar188._8_4_ = auVar50._8_4_ * fVar195;
  auVar188._12_4_ = auVar50._12_4_ * fVar206;
  auVar40 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar2,auVar40);
  auVar41 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar155);
  local_510 = vsubps_avx512vl(_local_5a0,auVar5);
  uVar110 = local_510._0_4_;
  auVar156._4_4_ = uVar110;
  auVar156._0_4_ = uVar110;
  auVar156._8_4_ = uVar110;
  auVar156._12_4_ = uVar110;
  auVar40 = vshufps_avx(local_510,local_510,0x55);
  auVar50 = vshufps_avx(local_510,local_510,0xaa);
  auVar196._0_4_ = auVar50._0_4_ * fVar193;
  auVar196._4_4_ = auVar50._4_4_ * fVar101;
  auVar196._8_4_ = auVar50._8_4_ * fVar195;
  auVar196._12_4_ = auVar50._12_4_ * fVar206;
  auVar40 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar2,auVar40);
  auVar43 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar156);
  local_520 = vsubps_avx512vl(_local_5b0,auVar5);
  uVar110 = local_520._0_4_;
  auVar157._4_4_ = uVar110;
  auVar157._0_4_ = uVar110;
  auVar157._8_4_ = uVar110;
  auVar157._12_4_ = uVar110;
  auVar40 = vshufps_avx(local_520,local_520,0x55);
  auVar50 = vshufps_avx(local_520,local_520,0xaa);
  auVar212._0_4_ = auVar50._0_4_ * fVar193;
  auVar212._4_4_ = auVar50._4_4_ * fVar101;
  auVar212._8_4_ = auVar50._8_4_ * fVar195;
  auVar212._12_4_ = auVar50._12_4_ * fVar206;
  auVar40 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar2,auVar40);
  auVar45 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar157);
  local_530 = vsubps_avx512vl(_local_570,auVar5);
  uVar110 = local_530._0_4_;
  auVar51._4_4_ = uVar110;
  auVar51._0_4_ = uVar110;
  auVar51._8_4_ = uVar110;
  auVar51._12_4_ = uVar110;
  auVar40 = vshufps_avx(local_530,local_530,0x55);
  auVar50 = vshufps_avx(local_530,local_530,0xaa);
  auVar145._0_4_ = auVar50._0_4_ * fVar193;
  auVar145._4_4_ = auVar50._4_4_ * fVar101;
  auVar145._8_4_ = auVar50._8_4_ * fVar195;
  auVar145._12_4_ = auVar50._12_4_ * fVar206;
  auVar40 = vfmadd231ps_fma(auVar145,(undefined1  [16])aVar2,auVar40);
  auVar5 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar51);
  auVar3 = vmovlhps_avx(auVar46,auVar41);
  auVar47 = vmovlhps_avx512f(auVar42,auVar43);
  auVar4 = vmovlhps_avx512f(auVar52,auVar45);
  _local_4a0 = vmovlhps_avx512f(auVar44,auVar5);
  auVar40 = vminps_avx512vl(auVar3,auVar47);
  auVar49 = vmaxps_avx512vl(auVar3,auVar47);
  auVar50 = vminps_avx512vl(auVar4,_local_4a0);
  auVar50 = vminps_avx(auVar40,auVar50);
  auVar40 = vmaxps_avx512vl(auVar4,_local_4a0);
  auVar40 = vmaxps_avx(auVar49,auVar40);
  auVar49 = vshufpd_avx(auVar50,auVar50,3);
  auVar48 = vshufpd_avx(auVar40,auVar40,3);
  auVar50 = vminps_avx(auVar50,auVar49);
  auVar40 = vmaxps_avx(auVar40,auVar48);
  auVar50 = vandps_avx512vl(auVar50,auVar235._0_16_);
  auVar40 = vandps_avx512vl(auVar40,auVar235._0_16_);
  auVar40 = vmaxps_avx(auVar50,auVar40);
  auVar50 = vmovshdup_avx(auVar40);
  auVar40 = vmaxss_avx(auVar50,auVar40);
  auVar158._8_8_ = auVar46._0_8_;
  auVar158._0_8_ = auVar46._0_8_;
  auVar50 = vmovddup_avx512vl(auVar42);
  auVar49 = vmovddup_avx512vl(auVar52);
  auVar177._0_8_ = auVar44._0_8_;
  auVar177._8_8_ = auVar177._0_8_;
  local_4b0 = ZEXT416((uint)(auVar40._0_4_ * 9.536743e-07));
  local_440 = vbroadcastss_avx512vl(local_4b0);
  auVar40 = vxorps_avx512vl(local_440._0_16_,auVar236._0_16_);
  local_460 = vbroadcastss_avx512vl(auVar40);
  auVar106 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar106);
  bVar35 = false;
  uVar27 = 0;
  fVar193 = *(float *)(ray + k * 4 + 0xc0);
  local_470 = vsubps_avx512vl(auVar47,auVar3);
  local_480 = vsubps_avx512vl(auVar4,auVar47);
  local_490 = vsubps_avx512vl(_local_4a0,auVar4);
  local_5c0 = vsubps_avx(_local_550,local_540);
  local_5d0 = vsubps_avx512vl(_local_5a0,local_580);
  local_5e0 = vsubps_avx512vl(_local_5b0,local_590);
  _local_5f0 = vsubps_avx512vl(_local_570,local_560);
  auVar106 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar106);
  auVar40 = ZEXT816(0x3f80000000000000);
  auVar100._32_32_ = auVar106._32_32_;
  auVar42 = auVar40;
LAB_01a01bbd:
  auVar244 = ZEXT3264(local_460);
  auVar243 = ZEXT3264(local_440);
  auVar48 = vshufps_avx(auVar42,auVar42,0x50);
  auVar226._8_4_ = 0x3f800000;
  auVar226._0_8_ = 0x3f8000003f800000;
  auVar226._12_4_ = 0x3f800000;
  auVar229._16_4_ = 0x3f800000;
  auVar229._0_16_ = auVar226;
  auVar229._20_4_ = 0x3f800000;
  auVar229._24_4_ = 0x3f800000;
  auVar229._28_4_ = 0x3f800000;
  auVar46 = vsubps_avx(auVar226,auVar48);
  fVar101 = auVar48._0_4_;
  fVar107 = auVar41._0_4_;
  auVar126._0_4_ = fVar107 * fVar101;
  fVar195 = auVar48._4_4_;
  fVar108 = auVar41._4_4_;
  auVar126._4_4_ = fVar108 * fVar195;
  fVar206 = auVar48._8_4_;
  auVar126._8_4_ = fVar107 * fVar206;
  fVar208 = auVar48._12_4_;
  auVar126._12_4_ = fVar108 * fVar208;
  fVar109 = auVar43._0_4_;
  auVar134._0_4_ = fVar109 * fVar101;
  fVar119 = auVar43._4_4_;
  auVar134._4_4_ = fVar119 * fVar195;
  auVar134._8_4_ = fVar109 * fVar206;
  auVar134._12_4_ = fVar119 * fVar208;
  fVar131 = auVar45._0_4_;
  auVar146._0_4_ = fVar131 * fVar101;
  fVar132 = auVar45._4_4_;
  auVar146._4_4_ = fVar132 * fVar195;
  auVar146._8_4_ = fVar131 * fVar206;
  auVar146._12_4_ = fVar132 * fVar208;
  fVar133 = auVar5._0_4_;
  auVar112._0_4_ = fVar133 * fVar101;
  fVar194 = auVar5._4_4_;
  auVar112._4_4_ = fVar194 * fVar195;
  auVar112._8_4_ = fVar133 * fVar206;
  auVar112._12_4_ = fVar194 * fVar208;
  auVar52 = vfmadd231ps_fma(auVar126,auVar46,auVar158);
  auVar44 = vfmadd231ps_avx512vl(auVar134,auVar46,auVar50);
  auVar51 = vfmadd231ps_avx512vl(auVar146,auVar46,auVar49);
  auVar46 = vfmadd231ps_fma(auVar112,auVar177,auVar46);
  auVar48 = vmovshdup_avx(auVar40);
  fVar195 = auVar40._0_4_;
  fVar101 = (auVar48._0_4_ - fVar195) * 0.04761905;
  auVar172._4_4_ = fVar195;
  auVar172._0_4_ = fVar195;
  auVar172._8_4_ = fVar195;
  auVar172._12_4_ = fVar195;
  auVar172._16_4_ = fVar195;
  auVar172._20_4_ = fVar195;
  auVar172._24_4_ = fVar195;
  auVar172._28_4_ = fVar195;
  auVar124._0_8_ = auVar48._0_8_;
  auVar124._8_8_ = auVar124._0_8_;
  auVar124._16_8_ = auVar124._0_8_;
  auVar124._24_8_ = auVar124._0_8_;
  auVar74 = vsubps_avx(auVar124,auVar172);
  uVar110 = auVar52._0_4_;
  auVar125._4_4_ = uVar110;
  auVar125._0_4_ = uVar110;
  auVar125._8_4_ = uVar110;
  auVar125._12_4_ = uVar110;
  auVar125._16_4_ = uVar110;
  auVar125._20_4_ = uVar110;
  auVar125._24_4_ = uVar110;
  auVar125._28_4_ = uVar110;
  auVar82 = ZEXT1632(auVar52);
  auVar70 = auVar241._0_32_;
  auVar72 = vpermps_avx512vl(auVar70,auVar82);
  auVar75 = vbroadcastss_avx512vl(auVar44);
  auVar83 = ZEXT1632(auVar44);
  auVar73 = vpermps_avx512vl(auVar70,auVar83);
  auVar76 = vbroadcastss_avx512vl(auVar51);
  auVar69 = ZEXT1632(auVar51);
  auVar77 = vpermps_avx512vl(auVar70,auVar69);
  auVar78 = vbroadcastss_avx512vl(auVar46);
  auVar79 = ZEXT1632(auVar46);
  auVar70 = vpermps_avx512vl(auVar70,auVar79);
  auVar191._4_4_ = fVar101;
  auVar191._0_4_ = fVar101;
  auVar191._8_4_ = fVar101;
  auVar191._12_4_ = fVar101;
  auVar191._16_4_ = fVar101;
  auVar191._20_4_ = fVar101;
  auVar191._24_4_ = fVar101;
  auVar191._28_4_ = fVar101;
  auVar80 = auVar242._0_32_;
  auVar71 = vpermps_avx512vl(auVar80,auVar82);
  auVar165._8_4_ = 3;
  auVar165._0_8_ = 0x300000003;
  auVar165._12_4_ = 3;
  auVar165._16_4_ = 3;
  auVar165._20_4_ = 3;
  auVar165._24_4_ = 3;
  auVar165._28_4_ = 3;
  auVar66 = vpermps_avx512vl(auVar165,auVar82);
  auVar67 = vpermps_avx512vl(auVar80,auVar83);
  auVar82 = vpermps_avx2(auVar165,auVar83);
  auVar68 = vpermps_avx512vl(auVar80,auVar69);
  auVar83 = vpermps_avx2(auVar165,auVar69);
  auVar69 = vpermps_avx512vl(auVar80,auVar79);
  auVar79 = vpermps_avx512vl(auVar165,auVar79);
  auVar48 = vfmadd132ps_fma(auVar74,auVar172,_DAT_01f7b040);
  auVar74 = vsubps_avx(auVar229,ZEXT1632(auVar48));
  auVar80 = vmulps_avx512vl(auVar75,ZEXT1632(auVar48));
  auVar84 = ZEXT1632(auVar48);
  auVar81 = vmulps_avx512vl(auVar73,auVar84);
  auVar46 = vfmadd231ps_fma(auVar80,auVar74,auVar125);
  auVar52 = vfmadd231ps_fma(auVar81,auVar74,auVar72);
  auVar80 = vmulps_avx512vl(auVar76,auVar84);
  auVar81 = vmulps_avx512vl(auVar77,auVar84);
  auVar75 = vfmadd231ps_avx512vl(auVar80,auVar74,auVar75);
  auVar73 = vfmadd231ps_avx512vl(auVar81,auVar74,auVar73);
  auVar80 = vmulps_avx512vl(auVar78,auVar84);
  auVar81 = ZEXT1632(auVar48);
  auVar70 = vmulps_avx512vl(auVar70,auVar81);
  auVar76 = vfmadd231ps_avx512vl(auVar80,auVar74,auVar76);
  auVar77 = vfmadd231ps_avx512vl(auVar70,auVar74,auVar77);
  fVar206 = auVar48._0_4_;
  fVar208 = auVar48._4_4_;
  auVar18._4_4_ = fVar208 * auVar75._4_4_;
  auVar18._0_4_ = fVar206 * auVar75._0_4_;
  fVar205 = auVar48._8_4_;
  auVar18._8_4_ = fVar205 * auVar75._8_4_;
  fVar207 = auVar48._12_4_;
  auVar18._12_4_ = fVar207 * auVar75._12_4_;
  auVar18._16_4_ = auVar75._16_4_ * 0.0;
  auVar18._20_4_ = auVar75._20_4_ * 0.0;
  auVar18._24_4_ = auVar75._24_4_ * 0.0;
  auVar18._28_4_ = fVar195;
  auVar19._4_4_ = fVar208 * auVar73._4_4_;
  auVar19._0_4_ = fVar206 * auVar73._0_4_;
  auVar19._8_4_ = fVar205 * auVar73._8_4_;
  auVar19._12_4_ = fVar207 * auVar73._12_4_;
  auVar19._16_4_ = auVar73._16_4_ * 0.0;
  auVar19._20_4_ = auVar73._20_4_ * 0.0;
  auVar19._24_4_ = auVar73._24_4_ * 0.0;
  auVar19._28_4_ = auVar72._28_4_;
  auVar46 = vfmadd231ps_fma(auVar18,auVar74,ZEXT1632(auVar46));
  auVar52 = vfmadd231ps_fma(auVar19,auVar74,ZEXT1632(auVar52));
  auVar117._0_4_ = fVar206 * auVar76._0_4_;
  auVar117._4_4_ = fVar208 * auVar76._4_4_;
  auVar117._8_4_ = fVar205 * auVar76._8_4_;
  auVar117._12_4_ = fVar207 * auVar76._12_4_;
  auVar117._16_4_ = auVar76._16_4_ * 0.0;
  auVar117._20_4_ = auVar76._20_4_ * 0.0;
  auVar117._24_4_ = auVar76._24_4_ * 0.0;
  auVar117._28_4_ = 0;
  auVar20._4_4_ = fVar208 * auVar77._4_4_;
  auVar20._0_4_ = fVar206 * auVar77._0_4_;
  auVar20._8_4_ = fVar205 * auVar77._8_4_;
  auVar20._12_4_ = fVar207 * auVar77._12_4_;
  auVar20._16_4_ = auVar77._16_4_ * 0.0;
  auVar20._20_4_ = auVar77._20_4_ * 0.0;
  auVar20._24_4_ = auVar77._24_4_ * 0.0;
  auVar20._28_4_ = auVar76._28_4_;
  auVar44 = vfmadd231ps_fma(auVar117,auVar74,auVar75);
  auVar51 = vfmadd231ps_fma(auVar20,auVar74,auVar73);
  auVar21._28_4_ = auVar73._28_4_;
  auVar21._0_28_ =
       ZEXT1628(CONCAT412(fVar207 * auVar51._12_4_,
                          CONCAT48(fVar205 * auVar51._8_4_,
                                   CONCAT44(fVar208 * auVar51._4_4_,fVar206 * auVar51._0_4_))));
  auVar61 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar207 * auVar44._12_4_,
                                               CONCAT48(fVar205 * auVar44._8_4_,
                                                        CONCAT44(fVar208 * auVar44._4_4_,
                                                                 fVar206 * auVar44._0_4_)))),auVar74
                            ,ZEXT1632(auVar46));
  auVar65 = vfmadd231ps_fma(auVar21,auVar74,ZEXT1632(auVar52));
  auVar72 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar46));
  auVar75 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar52));
  auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar72 = vmulps_avx512vl(auVar72,auVar73);
  auVar75 = vmulps_avx512vl(auVar75,auVar73);
  auVar186._0_4_ = fVar101 * auVar72._0_4_;
  auVar186._4_4_ = fVar101 * auVar72._4_4_;
  auVar186._8_4_ = fVar101 * auVar72._8_4_;
  auVar186._12_4_ = fVar101 * auVar72._12_4_;
  auVar186._16_4_ = fVar101 * auVar72._16_4_;
  auVar186._20_4_ = fVar101 * auVar72._20_4_;
  auVar186._24_4_ = fVar101 * auVar72._24_4_;
  auVar186._28_4_ = 0;
  auVar72 = vmulps_avx512vl(auVar191,auVar75);
  auVar52 = vxorps_avx512vl(auVar78._0_16_,auVar78._0_16_);
  auVar75 = vpermt2ps_avx512vl(ZEXT1632(auVar61),_DAT_01fb9fc0,ZEXT1632(auVar52));
  auVar76 = vpermt2ps_avx512vl(ZEXT1632(auVar65),_DAT_01fb9fc0,ZEXT1632(auVar52));
  auVar118._0_4_ = auVar186._0_4_ + auVar61._0_4_;
  auVar118._4_4_ = auVar186._4_4_ + auVar61._4_4_;
  auVar118._8_4_ = auVar186._8_4_ + auVar61._8_4_;
  auVar118._12_4_ = auVar186._12_4_ + auVar61._12_4_;
  auVar118._16_4_ = auVar186._16_4_ + 0.0;
  auVar118._20_4_ = auVar186._20_4_ + 0.0;
  auVar118._24_4_ = auVar186._24_4_ + 0.0;
  auVar118._28_4_ = 0;
  auVar84 = ZEXT1632(auVar52);
  auVar77 = vpermt2ps_avx512vl(auVar186,_DAT_01fb9fc0,auVar84);
  auVar78 = vaddps_avx512vl(ZEXT1632(auVar65),auVar72);
  auVar70 = vpermt2ps_avx512vl(auVar72,_DAT_01fb9fc0,auVar84);
  auVar72 = vsubps_avx(auVar75,auVar77);
  auVar77 = vsubps_avx512vl(auVar76,auVar70);
  auVar70 = vmulps_avx512vl(auVar67,auVar81);
  auVar80 = vmulps_avx512vl(auVar82,auVar81);
  auVar70 = vfmadd231ps_avx512vl(auVar70,auVar74,auVar71);
  auVar71 = vfmadd231ps_avx512vl(auVar80,auVar74,auVar66);
  auVar66 = vmulps_avx512vl(auVar68,auVar81);
  auVar80 = vmulps_avx512vl(auVar83,auVar81);
  auVar66 = vfmadd231ps_avx512vl(auVar66,auVar74,auVar67);
  auVar82 = vfmadd231ps_avx512vl(auVar80,auVar74,auVar82);
  auVar67 = vmulps_avx512vl(auVar69,auVar81);
  auVar69 = vmulps_avx512vl(auVar79,auVar81);
  auVar46 = vfmadd231ps_fma(auVar67,auVar74,auVar68);
  auVar67 = vfmadd231ps_avx512vl(auVar69,auVar74,auVar83);
  auVar68 = vmulps_avx512vl(auVar81,auVar66);
  auVar79 = ZEXT1632(auVar48);
  auVar69 = vmulps_avx512vl(auVar79,auVar82);
  auVar70 = vfmadd231ps_avx512vl(auVar68,auVar74,auVar70);
  auVar71 = vfmadd231ps_avx512vl(auVar69,auVar74,auVar71);
  auVar67 = vmulps_avx512vl(auVar79,auVar67);
  auVar66 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar207 * auVar46._12_4_,
                                          CONCAT48(fVar205 * auVar46._8_4_,
                                                   CONCAT44(fVar208 * auVar46._4_4_,
                                                            fVar206 * auVar46._0_4_)))),auVar74,
                       auVar66);
  auVar82 = vfmadd231ps_avx512vl(auVar67,auVar74,auVar82);
  auVar22._4_4_ = fVar208 * auVar66._4_4_;
  auVar22._0_4_ = fVar206 * auVar66._0_4_;
  auVar22._8_4_ = fVar205 * auVar66._8_4_;
  auVar22._12_4_ = fVar207 * auVar66._12_4_;
  auVar22._16_4_ = auVar66._16_4_ * 0.0;
  auVar22._20_4_ = auVar66._20_4_ * 0.0;
  auVar22._24_4_ = auVar66._24_4_ * 0.0;
  auVar22._28_4_ = auVar83._28_4_;
  auVar83 = vmulps_avx512vl(auVar79,auVar82);
  auVar67 = vfmadd231ps_avx512vl(auVar22,auVar74,auVar70);
  auVar83 = vfmadd231ps_avx512vl(auVar83,auVar71,auVar74);
  auVar74 = vsubps_avx512vl(auVar66,auVar70);
  auVar82 = vsubps_avx512vl(auVar82,auVar71);
  auVar74 = vmulps_avx512vl(auVar74,auVar73);
  auVar82 = vmulps_avx512vl(auVar82,auVar73);
  fVar195 = fVar101 * auVar74._0_4_;
  fVar206 = fVar101 * auVar74._4_4_;
  auVar23._4_4_ = fVar206;
  auVar23._0_4_ = fVar195;
  fVar208 = fVar101 * auVar74._8_4_;
  auVar23._8_4_ = fVar208;
  fVar205 = fVar101 * auVar74._12_4_;
  auVar23._12_4_ = fVar205;
  fVar207 = fVar101 * auVar74._16_4_;
  auVar23._16_4_ = fVar207;
  fVar209 = fVar101 * auVar74._20_4_;
  auVar23._20_4_ = fVar209;
  fVar101 = fVar101 * auVar74._24_4_;
  auVar23._24_4_ = fVar101;
  auVar23._28_4_ = auVar74._28_4_;
  auVar82 = vmulps_avx512vl(auVar191,auVar82);
  auVar73 = vpermt2ps_avx512vl(auVar67,_DAT_01fb9fc0,auVar84);
  auVar70 = vpermt2ps_avx512vl(auVar83,_DAT_01fb9fc0,auVar84);
  auVar192._0_4_ = auVar67._0_4_ + fVar195;
  auVar192._4_4_ = auVar67._4_4_ + fVar206;
  auVar192._8_4_ = auVar67._8_4_ + fVar208;
  auVar192._12_4_ = auVar67._12_4_ + fVar205;
  auVar192._16_4_ = auVar67._16_4_ + fVar207;
  auVar192._20_4_ = auVar67._20_4_ + fVar209;
  auVar192._24_4_ = auVar67._24_4_ + fVar101;
  auVar192._28_4_ = auVar67._28_4_ + auVar74._28_4_;
  auVar74 = vpermt2ps_avx512vl(auVar23,_DAT_01fb9fc0,ZEXT1632(auVar52));
  auVar71 = vaddps_avx512vl(auVar83,auVar82);
  auVar82 = vpermt2ps_avx512vl(auVar82,_DAT_01fb9fc0,ZEXT1632(auVar52));
  auVar74 = vsubps_avx(auVar73,auVar74);
  auVar82 = vsubps_avx512vl(auVar70,auVar82);
  auVar129 = ZEXT1632(auVar61);
  auVar66 = vsubps_avx512vl(auVar67,auVar129);
  auVar141 = ZEXT1632(auVar65);
  auVar68 = vsubps_avx512vl(auVar83,auVar141);
  auVar69 = vsubps_avx512vl(auVar73,auVar75);
  auVar66 = vaddps_avx512vl(auVar66,auVar69);
  auVar69 = vsubps_avx512vl(auVar70,auVar76);
  auVar68 = vaddps_avx512vl(auVar68,auVar69);
  auVar69 = vmulps_avx512vl(auVar141,auVar66);
  auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar129,auVar68);
  auVar79 = vmulps_avx512vl(auVar78,auVar66);
  auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar118,auVar68);
  auVar80 = vmulps_avx512vl(auVar77,auVar66);
  auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar72,auVar68);
  auVar81 = vmulps_avx512vl(auVar76,auVar66);
  auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar75,auVar68);
  auVar84 = vmulps_avx512vl(auVar83,auVar66);
  auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar67,auVar68);
  auVar85 = vmulps_avx512vl(auVar71,auVar66);
  auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar192,auVar68);
  auVar86 = vmulps_avx512vl(auVar82,auVar66);
  auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar74,auVar68);
  auVar66 = vmulps_avx512vl(auVar70,auVar66);
  auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar73,auVar68);
  auVar68 = vminps_avx512vl(auVar69,auVar79);
  auVar69 = vmaxps_avx512vl(auVar69,auVar79);
  auVar79 = vminps_avx512vl(auVar80,auVar81);
  auVar68 = vminps_avx512vl(auVar68,auVar79);
  auVar79 = vmaxps_avx512vl(auVar80,auVar81);
  auVar69 = vmaxps_avx512vl(auVar69,auVar79);
  auVar79 = vminps_avx512vl(auVar84,auVar85);
  auVar80 = vmaxps_avx512vl(auVar84,auVar85);
  auVar81 = vminps_avx512vl(auVar86,auVar66);
  auVar79 = vminps_avx512vl(auVar79,auVar81);
  auVar68 = vminps_avx512vl(auVar68,auVar79);
  auVar66 = vmaxps_avx512vl(auVar86,auVar66);
  auVar66 = vmaxps_avx512vl(auVar80,auVar66);
  auVar66 = vmaxps_avx512vl(auVar69,auVar66);
  uVar12 = vcmpps_avx512vl(auVar68,local_440,2);
  uVar13 = vcmpps_avx512vl(auVar66,local_460,5);
  bVar25 = (byte)uVar12 & (byte)uVar13 & 0x7f;
  if (bVar25 != 0) {
    auVar66 = vsubps_avx512vl(auVar75,auVar129);
    auVar68 = vsubps_avx512vl(auVar76,auVar141);
    auVar69 = vsubps_avx512vl(auVar73,auVar67);
    auVar66 = vaddps_avx512vl(auVar66,auVar69);
    auVar69 = vsubps_avx512vl(auVar70,auVar83);
    auVar68 = vaddps_avx512vl(auVar68,auVar69);
    auVar69 = vmulps_avx512vl(auVar141,auVar66);
    auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar68,auVar129);
    auVar78 = vmulps_avx512vl(auVar78,auVar66);
    auVar78 = vfnmadd213ps_avx512vl(auVar118,auVar68,auVar78);
    auVar77 = vmulps_avx512vl(auVar77,auVar66);
    auVar77 = vfnmadd213ps_avx512vl(auVar72,auVar68,auVar77);
    auVar72 = vmulps_avx512vl(auVar76,auVar66);
    auVar76 = vfnmadd231ps_avx512vl(auVar72,auVar68,auVar75);
    auVar72 = vmulps_avx512vl(auVar83,auVar66);
    auVar83 = vfnmadd231ps_avx512vl(auVar72,auVar68,auVar67);
    auVar72 = vmulps_avx512vl(auVar71,auVar66);
    auVar71 = vfnmadd213ps_avx512vl(auVar192,auVar68,auVar72);
    auVar72 = vmulps_avx512vl(auVar82,auVar66);
    auVar67 = vfnmadd213ps_avx512vl(auVar74,auVar68,auVar72);
    auVar74 = vmulps_avx512vl(auVar70,auVar66);
    auVar73 = vfnmadd231ps_avx512vl(auVar74,auVar73,auVar68);
    auVar72 = vminps_avx(auVar69,auVar78);
    auVar74 = vmaxps_avx(auVar69,auVar78);
    auVar75 = vminps_avx(auVar77,auVar76);
    auVar75 = vminps_avx(auVar72,auVar75);
    auVar72 = vmaxps_avx(auVar77,auVar76);
    auVar74 = vmaxps_avx(auVar74,auVar72);
    auVar82 = vminps_avx(auVar83,auVar71);
    auVar72 = vmaxps_avx(auVar83,auVar71);
    auVar83 = vminps_avx(auVar67,auVar73);
    auVar82 = vminps_avx(auVar82,auVar83);
    auVar82 = vminps_avx(auVar75,auVar82);
    auVar75 = vmaxps_avx(auVar67,auVar73);
    auVar72 = vmaxps_avx(auVar72,auVar75);
    auVar74 = vmaxps_avx(auVar74,auVar72);
    uVar12 = vcmpps_avx512vl(auVar74,local_460,5);
    uVar13 = vcmpps_avx512vl(auVar82,local_440,2);
    bVar25 = bVar25 & (byte)uVar12 & (byte)uVar13;
    if (bVar25 != 0) {
      auStack_630[uVar27] = (uint)bVar25;
      uVar12 = vmovlps_avx(auVar40);
      (&uStack_420)[uVar27] = uVar12;
      uVar32 = vmovlps_avx(auVar42);
      auStack_3a0[uVar27] = uVar32;
      uVar27 = (ulong)((int)uVar27 + 1);
    }
  }
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar106 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar235 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar236 = ZEXT1664(auVar40);
  auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar237 = ZEXT3264(auVar74);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar238 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar239 = ZEXT1664(auVar40);
  auVar87._32_32_ = auVar100._32_32_;
  auVar87._0_32_ = _DAT_01fb9fe0;
  auVar240 = ZEXT3264(_DAT_01fb9fe0);
LAB_01a020a0:
  do {
    do {
      do {
        if ((int)uVar27 == 0) {
          if (bVar35) goto LAB_01a02ff4;
          uVar110 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar17._4_4_ = uVar110;
          auVar17._0_4_ = uVar110;
          auVar17._8_4_ = uVar110;
          auVar17._12_4_ = uVar110;
          auVar17._16_4_ = uVar110;
          auVar17._20_4_ = uVar110;
          auVar17._24_4_ = uVar110;
          auVar17._28_4_ = uVar110;
          uVar12 = vcmpps_avx512vl(local_3c0,auVar17,2);
          uVar33 = (ulong)((uint)uVar34 & (uint)uVar12);
          goto LAB_01a0143e;
        }
        uVar26 = (int)uVar27 - 1;
        uVar28 = (ulong)uVar26;
        uVar7 = auStack_630[uVar28];
        auVar42._8_8_ = 0;
        auVar42._0_8_ = auStack_3a0[uVar28];
        uVar32 = 0;
        for (uVar31 = (ulong)uVar7; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
          uVar32 = uVar32 + 1;
        }
        uVar30 = uVar7 - 1 & uVar7;
        bVar38 = uVar30 == 0;
        auStack_630[uVar28] = uVar30;
        if (bVar38) {
          uVar27 = (ulong)uVar26;
        }
        auVar102._8_8_ = 0;
        auVar102._0_8_ = uVar32;
        auVar40 = vpunpcklqdq_avx(auVar102,ZEXT416((int)uVar32 + 1));
        auVar100._32_32_ = auVar87._32_32_;
        auVar40 = vcvtqq2ps_avx512vl(auVar40);
        auVar40 = vmulps_avx512vl(auVar40,auVar238._0_16_);
        uVar110 = *(undefined4 *)((long)&uStack_420 + uVar28 * 8 + 4);
        auVar14._4_4_ = uVar110;
        auVar14._0_4_ = uVar110;
        auVar14._8_4_ = uVar110;
        auVar14._12_4_ = uVar110;
        auVar48 = vmulps_avx512vl(auVar40,auVar14);
        auVar46 = auVar239._0_16_;
        auVar40 = vsubps_avx512vl(auVar46,auVar40);
        uVar110 = *(undefined4 *)(&uStack_420 + uVar28);
        auVar15._4_4_ = uVar110;
        auVar15._0_4_ = uVar110;
        auVar15._8_4_ = uVar110;
        auVar15._12_4_ = uVar110;
        auVar40 = vfmadd231ps_avx512vl(auVar48,auVar40,auVar15);
        auVar48 = vmovshdup_avx(auVar40);
        fVar101 = auVar48._0_4_ - auVar40._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar101));
        if (uVar7 == 0 || bVar38) goto LAB_01a01bbd;
        auVar48 = vshufps_avx(auVar42,auVar42,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar101));
        auVar51 = vsubps_avx512vl(auVar46,auVar48);
        fVar195 = auVar48._0_4_;
        auVar135._0_4_ = fVar195 * fVar107;
        fVar206 = auVar48._4_4_;
        auVar135._4_4_ = fVar206 * fVar108;
        fVar208 = auVar48._8_4_;
        auVar135._8_4_ = fVar208 * fVar107;
        fVar205 = auVar48._12_4_;
        auVar135._12_4_ = fVar205 * fVar108;
        auVar147._0_4_ = fVar195 * fVar109;
        auVar147._4_4_ = fVar206 * fVar119;
        auVar147._8_4_ = fVar208 * fVar109;
        auVar147._12_4_ = fVar205 * fVar119;
        auVar159._0_4_ = fVar195 * fVar131;
        auVar159._4_4_ = fVar206 * fVar132;
        auVar159._8_4_ = fVar208 * fVar131;
        auVar159._12_4_ = fVar205 * fVar132;
        auVar120._0_4_ = fVar195 * fVar133;
        auVar120._4_4_ = fVar206 * fVar194;
        auVar120._8_4_ = fVar208 * fVar133;
        auVar120._12_4_ = fVar205 * fVar194;
        auVar48 = vfmadd231ps_fma(auVar135,auVar51,auVar158);
        auVar52 = vfmadd231ps_fma(auVar147,auVar51,auVar50);
        auVar44 = vfmadd231ps_fma(auVar159,auVar51,auVar49);
        auVar51 = vfmadd231ps_fma(auVar120,auVar51,auVar177);
        auVar130._16_16_ = auVar48;
        auVar130._0_16_ = auVar48;
        auVar142._16_16_ = auVar52;
        auVar142._0_16_ = auVar52;
        auVar151._16_16_ = auVar44;
        auVar151._0_16_ = auVar44;
        auVar72 = vpermps_avx512vl(auVar240._0_32_,ZEXT1632(auVar40));
        auVar74 = vsubps_avx(auVar142,auVar130);
        auVar52 = vfmadd213ps_fma(auVar74,auVar72,auVar130);
        auVar74 = vsubps_avx(auVar151,auVar142);
        auVar61 = vfmadd213ps_fma(auVar74,auVar72,auVar142);
        auVar48 = vsubps_avx(auVar51,auVar44);
        auVar143._16_16_ = auVar48;
        auVar143._0_16_ = auVar48;
        auVar48 = vfmadd213ps_fma(auVar143,auVar72,auVar151);
        auVar74 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar52));
        auVar52 = vfmadd213ps_fma(auVar74,auVar72,ZEXT1632(auVar52));
        auVar74 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar61));
        auVar48 = vfmadd213ps_fma(auVar74,auVar72,ZEXT1632(auVar61));
        auVar74 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar52));
        auVar64 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar74,auVar72);
        auVar100._0_32_ = vmulps_avx512vl(auVar74,auVar237._0_32_);
        fVar195 = fVar101 * 0.33333334;
        auVar160._0_8_ =
             CONCAT44(auVar64._4_4_ + fVar195 * auVar100._4_4_,
                      auVar64._0_4_ + fVar195 * auVar100._0_4_);
        auVar160._8_4_ = auVar64._8_4_ + fVar195 * auVar100._8_4_;
        auVar160._12_4_ = auVar64._12_4_ + fVar195 * auVar100._12_4_;
        auVar136._0_4_ = fVar195 * auVar100._16_4_;
        auVar136._4_4_ = fVar195 * auVar100._20_4_;
        auVar136._8_4_ = fVar195 * auVar100._24_4_;
        auVar136._12_4_ = fVar195 * auVar100._28_4_;
        auVar59 = vsubps_avx((undefined1  [16])0x0,auVar136);
        auVar61 = vshufpd_avx(auVar64,auVar64,3);
        auVar65 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar48 = vsubps_avx(auVar61,auVar64);
        auVar52 = vsubps_avx(auVar65,(undefined1  [16])0x0);
        auVar178._0_4_ = auVar48._0_4_ + auVar52._0_4_;
        auVar178._4_4_ = auVar48._4_4_ + auVar52._4_4_;
        auVar178._8_4_ = auVar48._8_4_ + auVar52._8_4_;
        auVar178._12_4_ = auVar48._12_4_ + auVar52._12_4_;
        auVar48 = vshufps_avx(auVar64,auVar64,0xb1);
        auVar52 = vshufps_avx(auVar160,auVar160,0xb1);
        auVar44 = vshufps_avx(auVar59,auVar59,0xb1);
        auVar51 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar227._4_4_ = auVar178._0_4_;
        auVar227._0_4_ = auVar178._0_4_;
        auVar227._8_4_ = auVar178._0_4_;
        auVar227._12_4_ = auVar178._0_4_;
        auVar55 = vshufps_avx(auVar178,auVar178,0x55);
        fVar195 = auVar55._0_4_;
        auVar189._0_4_ = auVar48._0_4_ * fVar195;
        fVar206 = auVar55._4_4_;
        auVar189._4_4_ = auVar48._4_4_ * fVar206;
        fVar208 = auVar55._8_4_;
        auVar189._8_4_ = auVar48._8_4_ * fVar208;
        fVar205 = auVar55._12_4_;
        auVar189._12_4_ = auVar48._12_4_ * fVar205;
        auVar197._0_4_ = auVar52._0_4_ * fVar195;
        auVar197._4_4_ = auVar52._4_4_ * fVar206;
        auVar197._8_4_ = auVar52._8_4_ * fVar208;
        auVar197._12_4_ = auVar52._12_4_ * fVar205;
        auVar213._0_4_ = auVar44._0_4_ * fVar195;
        auVar213._4_4_ = auVar44._4_4_ * fVar206;
        auVar213._8_4_ = auVar44._8_4_ * fVar208;
        auVar213._12_4_ = auVar44._12_4_ * fVar205;
        auVar179._0_4_ = auVar51._0_4_ * fVar195;
        auVar179._4_4_ = auVar51._4_4_ * fVar206;
        auVar179._8_4_ = auVar51._8_4_ * fVar208;
        auVar179._12_4_ = auVar51._12_4_ * fVar205;
        auVar48 = vfmadd231ps_fma(auVar189,auVar227,auVar64);
        auVar52 = vfmadd231ps_fma(auVar197,auVar227,auVar160);
        auVar57 = vfmadd231ps_fma(auVar213,auVar227,auVar59);
        auVar58 = vfmadd231ps_fma(auVar179,(undefined1  [16])0x0,auVar227);
        auVar55 = vshufpd_avx(auVar48,auVar48,1);
        auVar56 = vshufpd_avx(auVar52,auVar52,1);
        auVar87._16_48_ = auVar100._16_48_;
        auVar53 = vshufpd_avx512vl(auVar57,auVar57,1);
        auVar54 = vshufpd_avx512vl(auVar58,auVar58,1);
        auVar44 = vminss_avx(auVar48,auVar52);
        auVar48 = vmaxss_avx(auVar52,auVar48);
        auVar51 = vminss_avx(auVar57,auVar58);
        auVar52 = vmaxss_avx(auVar58,auVar57);
        auVar44 = vminss_avx(auVar44,auVar51);
        auVar48 = vmaxss_avx(auVar52,auVar48);
        auVar51 = vminss_avx(auVar55,auVar56);
        auVar52 = vmaxss_avx(auVar56,auVar55);
        auVar55 = vminss_avx512f(auVar53,auVar54);
        auVar56 = vmaxss_avx512f(auVar54,auVar53);
        auVar52 = vmaxss_avx(auVar56,auVar52);
        auVar87._0_16_ = vminss_avx512f(auVar51,auVar55);
        fVar206 = auVar52._0_4_;
        fVar195 = auVar48._0_4_;
        if (auVar44._0_4_ < 0.0001) {
          bVar39 = fVar206 == -0.0001;
          bVar36 = NAN(fVar206);
          if (fVar206 <= -0.0001) goto LAB_01a022cd;
          break;
        }
LAB_01a022cd:
        vucomiss_avx512f(auVar87._0_16_);
        bVar39 = fVar206 <= -0.0001;
        bVar37 = -0.0001 < fVar195;
        bVar36 = bVar39;
        if (!bVar39) break;
        uVar12 = vcmpps_avx512vl(auVar44,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar13 = vcmpps_avx512vl(auVar87._0_16_,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar25 = (byte)uVar12 & (byte)uVar13;
        bVar24 = (bVar25 & 1) == 0;
        bVar39 = bVar37 && bVar24;
        bVar36 = bVar37 && (bVar25 & 1) == 0;
      } while (!bVar37 || !bVar24);
      auVar56 = vxorps_avx512vl(auVar244._0_16_,auVar244._0_16_);
      auVar244 = ZEXT1664(auVar56);
      vcmpss_avx512f(auVar44,auVar56,1);
      uVar12 = vcmpss_avx512f(auVar48,auVar56,1);
      bVar37 = (bool)((byte)uVar12 & 1);
      auVar89._16_48_ = auVar87._16_48_;
      auVar89._0_16_ = auVar245._0_16_;
      auVar88._4_60_ = auVar89._4_60_;
      auVar88._0_4_ = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * auVar245._0_4_);
      vucomiss_avx512f(auVar88._0_16_);
      bVar36 = (bool)(!bVar39 | bVar36);
      bVar37 = bVar36 == false;
      auVar91._16_48_ = auVar87._16_48_;
      auVar91._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar90._4_60_ = auVar91._4_60_;
      auVar90._0_4_ = (uint)bVar36 * auVar56._0_4_ + (uint)!bVar36 * 0x7f800000;
      auVar55 = auVar90._0_16_;
      auVar93._16_48_ = auVar87._16_48_;
      auVar93._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar92._4_60_ = auVar93._4_60_;
      auVar92._0_4_ = (uint)bVar36 * auVar56._0_4_ + (uint)!bVar36 * -0x800000;
      auVar51 = auVar92._0_16_;
      auVar57 = vxorps_avx512vl(auVar243._0_16_,auVar243._0_16_);
      auVar243 = ZEXT1664(auVar57);
      uVar12 = vcmpss_avx512f(auVar87._0_16_,auVar56,1);
      bVar39 = (bool)((byte)uVar12 & 1);
      auVar95._16_48_ = auVar87._16_48_;
      auVar95._0_16_ = auVar245._0_16_;
      auVar94._4_60_ = auVar95._4_60_;
      auVar94._0_4_ = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * auVar245._0_4_);
      vucomiss_avx512f(auVar94._0_16_);
      if ((bVar36) || (bVar37)) {
        auVar56 = vucomiss_avx512f(auVar44);
        if ((bVar36) || (bVar37)) {
          auVar58 = vxorps_avx512vl(auVar44,auVar236._0_16_);
          auVar44 = vsubss_avx512f(auVar56,auVar44);
          auVar44 = vdivss_avx512f(auVar58,auVar44);
          auVar56 = vsubss_avx512f(ZEXT416(0x3f800000),auVar44);
          auVar56 = vfmadd213ss_avx512f(auVar56,auVar57,auVar44);
          auVar44 = auVar56;
        }
        else {
          auVar44 = vxorps_avx512vl(auVar56,auVar56);
          vucomiss_avx512f(auVar44);
          auVar56 = ZEXT416(0x3f800000);
          if ((bVar36) || (bVar37)) {
            auVar56 = SUB6416(ZEXT464(0xff800000),0);
            auVar44 = ZEXT416(0x7f800000);
          }
        }
        auVar55 = vminss_avx512f(auVar55,auVar44);
        auVar51 = vmaxss_avx(auVar56,auVar51);
      }
      auVar245 = ZEXT464(0x3f800000);
      uVar12 = vcmpss_avx512f(auVar52,auVar57,1);
      bVar39 = (bool)((byte)uVar12 & 1);
      auVar52 = auVar245._0_16_;
      fVar208 = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * 0x3f800000);
      if ((auVar88._0_4_ != fVar208) || (NAN(auVar88._0_4_) || NAN(fVar208))) {
        if ((fVar206 != fVar195) || (NAN(fVar206) || NAN(fVar195))) {
          auVar48 = vxorps_avx512vl(auVar48,auVar236._0_16_);
          auVar180._0_4_ = auVar48._0_4_ / (fVar206 - fVar195);
          auVar180._4_12_ = auVar48._4_12_;
          auVar48 = vsubss_avx512f(auVar52,auVar180);
          auVar48 = vfmadd213ss_avx512f(auVar48,auVar57,auVar180);
          auVar44 = auVar48;
        }
        else if ((fVar195 != 0.0) ||
                (auVar48 = auVar52, auVar44 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar195))) {
          auVar48 = SUB6416(ZEXT464(0xff800000),0);
          auVar44 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar55 = vminss_avx(auVar55,auVar44);
        auVar51 = vmaxss_avx(auVar48,auVar51);
      }
      bVar39 = auVar94._0_4_ != fVar208;
      auVar48 = vminss_avx512f(auVar55,auVar52);
      auVar97._16_48_ = auVar87._16_48_;
      auVar97._0_16_ = auVar55;
      auVar96._4_60_ = auVar97._4_60_;
      auVar96._0_4_ = (uint)bVar39 * auVar48._0_4_ + (uint)!bVar39 * auVar55._0_4_;
      auVar48 = vmaxss_avx512f(auVar52,auVar51);
      auVar99._16_48_ = auVar87._16_48_;
      auVar99._0_16_ = auVar51;
      auVar98._4_60_ = auVar99._4_60_;
      auVar98._0_4_ = (uint)bVar39 * auVar48._0_4_ + (uint)!bVar39 * auVar51._0_4_;
      auVar48 = vmaxss_avx512f(auVar57,auVar96._0_16_);
      auVar87._0_16_ = vminss_avx512f(auVar98._0_16_,auVar52);
    } while (auVar87._0_4_ < auVar48._0_4_);
    auVar58 = vmaxss_avx512f(auVar57,ZEXT416((uint)(auVar48._0_4_ + -0.1)));
    auVar54 = vminss_avx512f(ZEXT416((uint)(auVar87._0_4_ + 0.1)),auVar52);
    auVar121._0_8_ = auVar64._0_8_;
    auVar121._8_8_ = auVar121._0_8_;
    auVar198._8_8_ = auVar160._0_8_;
    auVar198._0_8_ = auVar160._0_8_;
    auVar214._8_8_ = auVar59._0_8_;
    auVar214._0_8_ = auVar59._0_8_;
    auVar48 = vshufpd_avx(auVar160,auVar160,3);
    auVar44 = vshufpd_avx(auVar59,auVar59,3);
    auVar51 = vshufps_avx(auVar58,auVar54,0);
    auVar56 = vsubps_avx512vl(auVar46,auVar51);
    fVar195 = auVar51._0_4_;
    auVar148._0_4_ = fVar195 * auVar61._0_4_;
    fVar206 = auVar51._4_4_;
    auVar148._4_4_ = fVar206 * auVar61._4_4_;
    fVar208 = auVar51._8_4_;
    auVar148._8_4_ = fVar208 * auVar61._8_4_;
    fVar205 = auVar51._12_4_;
    auVar148._12_4_ = fVar205 * auVar61._12_4_;
    auVar161._0_4_ = fVar195 * auVar48._0_4_;
    auVar161._4_4_ = fVar206 * auVar48._4_4_;
    auVar161._8_4_ = fVar208 * auVar48._8_4_;
    auVar161._12_4_ = fVar205 * auVar48._12_4_;
    auVar230._0_4_ = auVar44._0_4_ * fVar195;
    auVar230._4_4_ = auVar44._4_4_ * fVar206;
    auVar230._8_4_ = auVar44._8_4_ * fVar208;
    auVar230._12_4_ = auVar44._12_4_ * fVar205;
    auVar137._0_4_ = fVar195 * auVar65._0_4_;
    auVar137._4_4_ = fVar206 * auVar65._4_4_;
    auVar137._8_4_ = fVar208 * auVar65._8_4_;
    auVar137._12_4_ = fVar205 * auVar65._12_4_;
    auVar61 = vfmadd231ps_fma(auVar148,auVar56,auVar121);
    auVar65 = vfmadd231ps_fma(auVar161,auVar56,auVar198);
    auVar55 = vfmadd231ps_fma(auVar230,auVar56,auVar214);
    auVar56 = vfmadd231ps_fma(auVar137,auVar56,ZEXT816(0));
    auVar44 = vsubss_avx512f(auVar52,auVar58);
    auVar48 = vmovshdup_avx(auVar42);
    auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar48._0_4_ * auVar58._0_4_)),auVar42,auVar44);
    auVar44 = vsubss_avx512f(auVar52,auVar54);
    auVar54 = vfmadd231ss_fma(ZEXT416((uint)(auVar48._0_4_ * auVar54._0_4_)),auVar42,auVar44);
    auVar59 = vdivss_avx512f(auVar52,ZEXT416((uint)fVar101));
    auVar48 = vsubps_avx(auVar65,auVar61);
    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar44 = vmulps_avx512vl(auVar48,auVar58);
    auVar48 = vsubps_avx(auVar55,auVar65);
    auVar51 = vmulps_avx512vl(auVar48,auVar58);
    auVar48 = vsubps_avx(auVar56,auVar55);
    auVar48 = vmulps_avx512vl(auVar48,auVar58);
    auVar42 = vminps_avx(auVar51,auVar48);
    auVar48 = vmaxps_avx(auVar51,auVar48);
    auVar42 = vminps_avx(auVar44,auVar42);
    auVar48 = vmaxps_avx(auVar44,auVar48);
    auVar44 = vshufpd_avx(auVar42,auVar42,3);
    auVar51 = vshufpd_avx(auVar48,auVar48,3);
    auVar42 = vminps_avx(auVar42,auVar44);
    auVar48 = vmaxps_avx(auVar48,auVar51);
    fVar101 = auVar59._0_4_;
    auVar181._0_4_ = auVar42._0_4_ * fVar101;
    auVar181._4_4_ = auVar42._4_4_ * fVar101;
    auVar181._8_4_ = auVar42._8_4_ * fVar101;
    auVar181._12_4_ = auVar42._12_4_ * fVar101;
    auVar168._0_4_ = fVar101 * auVar48._0_4_;
    auVar168._4_4_ = fVar101 * auVar48._4_4_;
    auVar168._8_4_ = fVar101 * auVar48._8_4_;
    auVar168._12_4_ = fVar101 * auVar48._12_4_;
    auVar59 = vdivss_avx512f(auVar52,ZEXT416((uint)(auVar54._0_4_ - auVar53._0_4_)));
    auVar48 = vshufpd_avx(auVar61,auVar61,3);
    auVar42 = vshufpd_avx(auVar65,auVar65,3);
    auVar44 = vshufpd_avx(auVar55,auVar55,3);
    auVar51 = vshufpd_avx(auVar56,auVar56,3);
    auVar48 = vsubps_avx(auVar48,auVar61);
    auVar61 = vsubps_avx(auVar42,auVar65);
    auVar65 = vsubps_avx(auVar44,auVar55);
    auVar51 = vsubps_avx(auVar51,auVar56);
    auVar42 = vminps_avx(auVar48,auVar61);
    auVar48 = vmaxps_avx(auVar48,auVar61);
    auVar44 = vminps_avx(auVar65,auVar51);
    auVar44 = vminps_avx(auVar42,auVar44);
    auVar42 = vmaxps_avx(auVar65,auVar51);
    auVar48 = vmaxps_avx(auVar48,auVar42);
    fVar101 = auVar59._0_4_;
    auVar215._0_4_ = fVar101 * auVar44._0_4_;
    auVar215._4_4_ = fVar101 * auVar44._4_4_;
    auVar215._8_4_ = fVar101 * auVar44._8_4_;
    auVar215._12_4_ = fVar101 * auVar44._12_4_;
    auVar199._0_4_ = fVar101 * auVar48._0_4_;
    auVar199._4_4_ = fVar101 * auVar48._4_4_;
    auVar199._8_4_ = fVar101 * auVar48._8_4_;
    auVar199._12_4_ = fVar101 * auVar48._12_4_;
    auVar51 = vinsertps_avx(auVar40,auVar53,0x10);
    auVar60 = vpermt2ps_avx512vl(auVar40,_DAT_01fb9f90,auVar54);
    auVar111._0_4_ = auVar51._0_4_ + auVar60._0_4_;
    auVar111._4_4_ = auVar51._4_4_ + auVar60._4_4_;
    auVar111._8_4_ = auVar51._8_4_ + auVar60._8_4_;
    auVar111._12_4_ = auVar51._12_4_ + auVar60._12_4_;
    auVar59 = vmulps_avx512vl(auVar111,auVar106._0_16_);
    auVar42 = vshufps_avx(auVar59,auVar59,0x54);
    uVar110 = auVar59._0_4_;
    auVar113._4_4_ = uVar110;
    auVar113._0_4_ = uVar110;
    auVar113._8_4_ = uVar110;
    auVar113._12_4_ = uVar110;
    auVar44 = vfmadd213ps_fma(local_470,auVar113,auVar3);
    auVar61 = vfmadd213ps_fma(local_480,auVar113,auVar47);
    auVar65 = vfmadd213ps_fma(local_490,auVar113,auVar4);
    auVar48 = vsubps_avx(auVar61,auVar44);
    auVar44 = vfmadd213ps_fma(auVar48,auVar113,auVar44);
    auVar48 = vsubps_avx(auVar65,auVar61);
    auVar48 = vfmadd213ps_fma(auVar48,auVar113,auVar61);
    auVar48 = vsubps_avx(auVar48,auVar44);
    auVar44 = vfmadd231ps_fma(auVar44,auVar48,auVar113);
    auVar55 = vmulps_avx512vl(auVar48,auVar58);
    auVar222._8_8_ = auVar44._0_8_;
    auVar222._0_8_ = auVar44._0_8_;
    auVar48 = vshufpd_avx(auVar44,auVar44,3);
    auVar44 = vshufps_avx(auVar59,auVar59,0x55);
    auVar61 = vsubps_avx(auVar48,auVar222);
    auVar65 = vfmadd231ps_fma(auVar222,auVar44,auVar61);
    auVar231._8_8_ = auVar55._0_8_;
    auVar231._0_8_ = auVar55._0_8_;
    auVar48 = vshufpd_avx(auVar55,auVar55,3);
    auVar48 = vsubps_avx512vl(auVar48,auVar231);
    auVar48 = vfmadd213ps_avx512vl(auVar48,auVar44,auVar231);
    auVar114._0_8_ = auVar61._0_8_ ^ 0x8000000080000000;
    auVar114._8_4_ = auVar61._8_4_ ^ 0x80000000;
    auVar114._12_4_ = auVar61._12_4_ ^ 0x80000000;
    auVar44 = vmovshdup_avx512vl(auVar48);
    auVar232._0_8_ = auVar44._0_8_ ^ 0x8000000080000000;
    auVar232._8_4_ = auVar44._8_4_ ^ 0x80000000;
    auVar232._12_4_ = auVar44._12_4_ ^ 0x80000000;
    auVar55 = vmovshdup_avx512vl(auVar61);
    auVar56 = vpermt2ps_avx512vl(auVar232,ZEXT416(5),auVar61);
    auVar244 = ZEXT464(0x40400000);
    auVar44 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar44._0_4_ * auVar61._0_4_)),auVar48,auVar55);
    auVar61 = vpermt2ps_avx512vl(auVar48,SUB6416(ZEXT464(4),0),auVar114);
    auVar138._0_4_ = auVar44._0_4_;
    auVar138._4_4_ = auVar138._0_4_;
    auVar138._8_4_ = auVar138._0_4_;
    auVar138._12_4_ = auVar138._0_4_;
    auVar48 = vdivps_avx(auVar56,auVar138);
    auVar62 = vdivps_avx512vl(auVar61,auVar138);
    fVar101 = auVar65._0_4_;
    auVar44 = vshufps_avx(auVar65,auVar65,0x55);
    auVar223._0_4_ = fVar101 * auVar48._0_4_ + auVar44._0_4_ * auVar62._0_4_;
    auVar223._4_4_ = fVar101 * auVar48._4_4_ + auVar44._4_4_ * auVar62._4_4_;
    auVar223._8_4_ = fVar101 * auVar48._8_4_ + auVar44._8_4_ * auVar62._8_4_;
    auVar223._12_4_ = fVar101 * auVar48._12_4_ + auVar44._12_4_ * auVar62._12_4_;
    auVar58 = vsubps_avx(auVar42,auVar223);
    auVar44 = vmovshdup_avx(auVar48);
    auVar42 = vinsertps_avx(auVar181,auVar215,0x1c);
    auVar233._0_4_ = auVar44._0_4_ * auVar42._0_4_;
    auVar233._4_4_ = auVar44._4_4_ * auVar42._4_4_;
    auVar233._8_4_ = auVar44._8_4_ * auVar42._8_4_;
    auVar233._12_4_ = auVar44._12_4_ * auVar42._12_4_;
    auVar64 = vinsertps_avx512f(auVar168,auVar199,0x1c);
    auVar44 = vmulps_avx512vl(auVar44,auVar64);
    auVar56 = vminps_avx512vl(auVar233,auVar44);
    auVar65 = vmaxps_avx(auVar44,auVar233);
    auVar55 = vmovshdup_avx(auVar62);
    auVar44 = vinsertps_avx(auVar215,auVar181,0x4c);
    auVar216._0_4_ = auVar55._0_4_ * auVar44._0_4_;
    auVar216._4_4_ = auVar55._4_4_ * auVar44._4_4_;
    auVar216._8_4_ = auVar55._8_4_ * auVar44._8_4_;
    auVar216._12_4_ = auVar55._12_4_ * auVar44._12_4_;
    auVar61 = vinsertps_avx(auVar199,auVar168,0x4c);
    auVar200._0_4_ = auVar55._0_4_ * auVar61._0_4_;
    auVar200._4_4_ = auVar55._4_4_ * auVar61._4_4_;
    auVar200._8_4_ = auVar55._8_4_ * auVar61._8_4_;
    auVar200._12_4_ = auVar55._12_4_ * auVar61._12_4_;
    auVar55 = vminps_avx(auVar216,auVar200);
    auVar56 = vaddps_avx512vl(auVar56,auVar55);
    auVar55 = vmaxps_avx(auVar200,auVar216);
    auVar201._0_4_ = auVar65._0_4_ + auVar55._0_4_;
    auVar201._4_4_ = auVar65._4_4_ + auVar55._4_4_;
    auVar201._8_4_ = auVar65._8_4_ + auVar55._8_4_;
    auVar201._12_4_ = auVar65._12_4_ + auVar55._12_4_;
    auVar217._8_8_ = 0x3f80000000000000;
    auVar217._0_8_ = 0x3f80000000000000;
    auVar65 = vsubps_avx(auVar217,auVar201);
    auVar55 = vsubps_avx(auVar217,auVar56);
    auVar56 = vsubps_avx(auVar51,auVar59);
    auVar59 = vsubps_avx(auVar60,auVar59);
    fVar205 = auVar56._0_4_;
    auVar234._0_4_ = fVar205 * auVar65._0_4_;
    fVar207 = auVar56._4_4_;
    auVar234._4_4_ = fVar207 * auVar65._4_4_;
    fVar209 = auVar56._8_4_;
    auVar234._8_4_ = fVar209 * auVar65._8_4_;
    fVar210 = auVar56._12_4_;
    auVar234._12_4_ = fVar210 * auVar65._12_4_;
    auVar63 = vbroadcastss_avx512vl(auVar48);
    auVar42 = vmulps_avx512vl(auVar63,auVar42);
    auVar64 = vmulps_avx512vl(auVar63,auVar64);
    auVar63 = vminps_avx512vl(auVar42,auVar64);
    auVar64 = vmaxps_avx512vl(auVar64,auVar42);
    auVar42 = vbroadcastss_avx512vl(auVar62);
    auVar44 = vmulps_avx512vl(auVar42,auVar44);
    auVar42 = vmulps_avx512vl(auVar42,auVar61);
    auVar61 = vminps_avx512vl(auVar44,auVar42);
    auVar61 = vaddps_avx512vl(auVar63,auVar61);
    auVar56 = vmulps_avx512vl(auVar56,auVar55);
    fVar101 = auVar59._0_4_;
    auVar202._0_4_ = fVar101 * auVar65._0_4_;
    fVar195 = auVar59._4_4_;
    auVar202._4_4_ = fVar195 * auVar65._4_4_;
    fVar206 = auVar59._8_4_;
    auVar202._8_4_ = fVar206 * auVar65._8_4_;
    fVar208 = auVar59._12_4_;
    auVar202._12_4_ = fVar208 * auVar65._12_4_;
    auVar218._0_4_ = fVar101 * auVar55._0_4_;
    auVar218._4_4_ = fVar195 * auVar55._4_4_;
    auVar218._8_4_ = fVar206 * auVar55._8_4_;
    auVar218._12_4_ = fVar208 * auVar55._12_4_;
    auVar42 = vmaxps_avx(auVar42,auVar44);
    auVar169._0_4_ = auVar64._0_4_ + auVar42._0_4_;
    auVar169._4_4_ = auVar64._4_4_ + auVar42._4_4_;
    auVar169._8_4_ = auVar64._8_4_ + auVar42._8_4_;
    auVar169._12_4_ = auVar64._12_4_ + auVar42._12_4_;
    auVar182._8_8_ = 0x3f800000;
    auVar182._0_8_ = 0x3f800000;
    auVar42 = vsubps_avx(auVar182,auVar169);
    auVar44 = vsubps_avx512vl(auVar182,auVar61);
    auVar228._0_4_ = fVar205 * auVar42._0_4_;
    auVar228._4_4_ = fVar207 * auVar42._4_4_;
    auVar228._8_4_ = fVar209 * auVar42._8_4_;
    auVar228._12_4_ = fVar210 * auVar42._12_4_;
    auVar224._0_4_ = fVar205 * auVar44._0_4_;
    auVar224._4_4_ = fVar207 * auVar44._4_4_;
    auVar224._8_4_ = fVar209 * auVar44._8_4_;
    auVar224._12_4_ = fVar210 * auVar44._12_4_;
    auVar170._0_4_ = fVar101 * auVar42._0_4_;
    auVar170._4_4_ = fVar195 * auVar42._4_4_;
    auVar170._8_4_ = fVar206 * auVar42._8_4_;
    auVar170._12_4_ = fVar208 * auVar42._12_4_;
    auVar183._0_4_ = fVar101 * auVar44._0_4_;
    auVar183._4_4_ = fVar195 * auVar44._4_4_;
    auVar183._8_4_ = fVar206 * auVar44._8_4_;
    auVar183._12_4_ = fVar208 * auVar44._12_4_;
    auVar42 = vminps_avx(auVar228,auVar224);
    auVar44 = vminps_avx512vl(auVar170,auVar183);
    auVar61 = vminps_avx512vl(auVar42,auVar44);
    auVar42 = vmaxps_avx(auVar224,auVar228);
    auVar44 = vmaxps_avx(auVar183,auVar170);
    auVar44 = vmaxps_avx(auVar44,auVar42);
    auVar65 = vminps_avx512vl(auVar234,auVar56);
    auVar42 = vminps_avx(auVar202,auVar218);
    auVar42 = vminps_avx(auVar65,auVar42);
    auVar42 = vhaddps_avx(auVar61,auVar42);
    auVar87._0_16_ = vmaxps_avx512vl(auVar56,auVar234);
    auVar61 = vmaxps_avx(auVar218,auVar202);
    auVar61 = vmaxps_avx(auVar61,auVar87._0_16_);
    auVar44 = vhaddps_avx(auVar44,auVar61);
    auVar42 = vshufps_avx(auVar42,auVar42,0xe8);
    auVar44 = vshufps_avx(auVar44,auVar44,0xe8);
    auVar171._0_4_ = auVar42._0_4_ + auVar58._0_4_;
    auVar171._4_4_ = auVar42._4_4_ + auVar58._4_4_;
    auVar171._8_4_ = auVar42._8_4_ + auVar58._8_4_;
    auVar171._12_4_ = auVar42._12_4_ + auVar58._12_4_;
    auVar184._0_4_ = auVar44._0_4_ + auVar58._0_4_;
    auVar184._4_4_ = auVar44._4_4_ + auVar58._4_4_;
    auVar184._8_4_ = auVar44._8_4_ + auVar58._8_4_;
    auVar184._12_4_ = auVar44._12_4_ + auVar58._12_4_;
    auVar42 = vmaxps_avx(auVar51,auVar171);
    auVar44 = vminps_avx(auVar184,auVar60);
    uVar32 = vcmpps_avx512vl(auVar44,auVar42,1);
  } while ((uVar32 & 3) != 0);
  uVar32 = vcmpps_avx512vl(auVar184,auVar60,1);
  uVar12 = vcmpps_avx512vl(auVar40,auVar171,1);
  if (((ushort)uVar12 & (ushort)uVar32 & 1) == 0) {
    bVar25 = 0;
  }
  else {
    auVar42 = vmovshdup_avx(auVar171);
    bVar25 = auVar53._0_4_ < auVar42._0_4_ & (byte)(uVar32 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar27 || uVar7 != 0 && !bVar38) | bVar25) != 1) goto LAB_01a02f72;
  lVar29 = 0xc9;
  do {
    lVar29 = lVar29 + -1;
    if (lVar29 == 0) goto LAB_01a020a0;
    auVar40 = vsubss_avx512f(auVar52,auVar58);
    fVar206 = auVar40._0_4_;
    fVar101 = fVar206 * fVar206 * fVar206;
    auVar40 = vmulss_avx512f(auVar58,ZEXT416(0x40400000));
    fVar195 = auVar40._0_4_ * fVar206 * fVar206;
    fVar208 = auVar58._0_4_;
    auVar40 = vmulss_avx512f(ZEXT416((uint)(fVar208 * fVar208)),ZEXT416(0x40400000));
    fVar206 = fVar206 * auVar40._0_4_;
    auVar127._4_4_ = fVar101;
    auVar127._0_4_ = fVar101;
    auVar127._8_4_ = fVar101;
    auVar127._12_4_ = fVar101;
    auVar122._4_4_ = fVar195;
    auVar122._0_4_ = fVar195;
    auVar122._8_4_ = fVar195;
    auVar122._12_4_ = fVar195;
    auVar103._4_4_ = fVar206;
    auVar103._0_4_ = fVar206;
    auVar103._8_4_ = fVar206;
    auVar103._12_4_ = fVar206;
    fVar208 = fVar208 * fVar208 * fVar208;
    auVar149._0_4_ = (float)local_4a0._0_4_ * fVar208;
    auVar149._4_4_ = (float)local_4a0._4_4_ * fVar208;
    auVar149._8_4_ = fStack_498 * fVar208;
    auVar149._12_4_ = fStack_494 * fVar208;
    auVar40 = vfmadd231ps_fma(auVar149,auVar4,auVar103);
    auVar40 = vfmadd231ps_fma(auVar40,auVar47,auVar122);
    auVar40 = vfmadd231ps_fma(auVar40,auVar3,auVar127);
    auVar104._8_8_ = auVar40._0_8_;
    auVar104._0_8_ = auVar40._0_8_;
    auVar40 = vshufpd_avx(auVar40,auVar40,3);
    auVar42 = vshufps_avx(auVar58,auVar58,0x55);
    auVar40 = vsubps_avx(auVar40,auVar104);
    auVar42 = vfmadd213ps_fma(auVar40,auVar42,auVar104);
    fVar101 = auVar42._0_4_;
    auVar40 = vshufps_avx(auVar42,auVar42,0x55);
    auVar105._0_4_ = auVar48._0_4_ * fVar101 + auVar62._0_4_ * auVar40._0_4_;
    auVar105._4_4_ = auVar48._4_4_ * fVar101 + auVar62._4_4_ * auVar40._4_4_;
    auVar105._8_4_ = auVar48._8_4_ * fVar101 + auVar62._8_4_ * auVar40._8_4_;
    auVar105._12_4_ = auVar48._12_4_ * fVar101 + auVar62._12_4_ * auVar40._12_4_;
    auVar58 = vsubps_avx(auVar58,auVar105);
    auVar40 = vandps_avx512vl(auVar42,auVar235._0_16_);
    auVar87._0_16_ = vprolq_avx512vl(auVar40,0x20);
    auVar40 = vmaxss_avx(auVar87._0_16_,auVar40);
    bVar38 = (float)local_4b0._0_4_ < auVar40._0_4_;
  } while ((float)local_4b0._0_4_ <= auVar40._0_4_);
  auVar40 = vucomiss_avx512f(auVar57);
  if (bVar38) goto LAB_01a020a0;
  auVar48 = vucomiss_avx512f(auVar40);
  auVar245 = ZEXT1664(auVar48);
  if (bVar38) goto LAB_01a020a0;
  vmovshdup_avx(auVar40);
  auVar48 = vucomiss_avx512f(auVar57);
  if (bVar38) goto LAB_01a020a0;
  auVar42 = vucomiss_avx512f(auVar48);
  auVar245 = ZEXT1664(auVar42);
  if (bVar38) goto LAB_01a020a0;
  auVar52 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar59 = vinsertps_avx(auVar52,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar52 = vdpps_avx(auVar59,local_4c0,0x7f);
  auVar44 = vdpps_avx(auVar59,local_4d0,0x7f);
  auVar51 = vdpps_avx(auVar59,local_4e0,0x7f);
  auVar61 = vdpps_avx(auVar59,local_4f0,0x7f);
  auVar65 = vdpps_avx(auVar59,local_500,0x7f);
  auVar55 = vdpps_avx(auVar59,local_510,0x7f);
  auVar56 = vdpps_avx(auVar59,local_520,0x7f);
  auVar59 = vdpps_avx(auVar59,local_530,0x7f);
  auVar57 = vsubss_avx512f(auVar42,auVar48);
  fVar101 = auVar48._0_4_;
  auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar101 * auVar65._0_4_)),auVar57,auVar52);
  auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar55._0_4_ * fVar101)),auVar57,auVar44);
  auVar44 = vfmadd231ss_fma(ZEXT416((uint)(auVar56._0_4_ * fVar101)),auVar57,auVar51);
  auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar101 * auVar59._0_4_)),auVar57,auVar61);
  auVar42 = vsubss_avx512f(auVar42,auVar40);
  auVar150._0_4_ = auVar42._0_4_;
  fVar195 = auVar150._0_4_ * auVar150._0_4_ * auVar150._0_4_;
  auVar42 = vmulss_avx512f(auVar40,ZEXT416(0x40400000));
  fVar206 = auVar42._0_4_ * auVar150._0_4_ * auVar150._0_4_;
  fVar101 = auVar40._0_4_;
  auVar139._0_4_ = fVar101 * fVar101;
  auVar139._4_4_ = auVar40._4_4_ * auVar40._4_4_;
  auVar139._8_4_ = auVar40._8_4_ * auVar40._8_4_;
  auVar139._12_4_ = auVar40._12_4_ * auVar40._12_4_;
  auVar87._0_16_ = vmulss_avx512f(auVar139,ZEXT416(0x40400000));
  fVar208 = auVar150._0_4_ * auVar87._0_4_;
  fVar207 = fVar101 * auVar139._0_4_;
  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar207 * auVar51._0_4_)),ZEXT416((uint)fVar208),auVar44)
  ;
  auVar42 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar206),auVar52);
  auVar48 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar195),auVar48);
  fVar205 = auVar48._0_4_;
  if ((fVar205 < fVar193) || (fVar209 = *(float *)(ray + k * 4 + 0x200), fVar209 < fVar205))
  goto LAB_01a020a0;
  auVar48 = vshufps_avx(auVar40,auVar40,0x55);
  auVar52 = vsubps_avx512vl(auVar46,auVar48);
  fVar210 = auVar48._0_4_;
  auVar185._0_4_ = fVar210 * (float)local_550._0_4_;
  fVar219 = auVar48._4_4_;
  auVar185._4_4_ = fVar219 * (float)local_550._4_4_;
  fVar220 = auVar48._8_4_;
  auVar185._8_4_ = fVar220 * fStack_548;
  fVar221 = auVar48._12_4_;
  auVar185._12_4_ = fVar221 * fStack_544;
  auVar190._0_4_ = fVar210 * (float)local_5a0._0_4_;
  auVar190._4_4_ = fVar219 * (float)local_5a0._4_4_;
  auVar190._8_4_ = fVar220 * fStack_598;
  auVar190._12_4_ = fVar221 * fStack_594;
  auVar203._0_4_ = fVar210 * (float)local_5b0._0_4_;
  auVar203._4_4_ = fVar219 * (float)local_5b0._4_4_;
  auVar203._8_4_ = fVar220 * fStack_5a8;
  auVar203._12_4_ = fVar221 * fStack_5a4;
  auVar162._0_4_ = fVar210 * (float)local_570._0_4_;
  auVar162._4_4_ = fVar219 * (float)local_570._4_4_;
  auVar162._8_4_ = fVar220 * fStack_568;
  auVar162._12_4_ = fVar221 * fStack_564;
  auVar48 = vfmadd231ps_fma(auVar185,auVar52,local_540);
  auVar46 = vfmadd231ps_fma(auVar190,auVar52,local_580);
  auVar42 = vfmadd231ps_fma(auVar203,auVar52,local_590);
  auVar52 = vfmadd231ps_fma(auVar162,auVar52,local_560);
  auVar48 = vsubps_avx(auVar46,auVar48);
  auVar46 = vsubps_avx(auVar42,auVar46);
  auVar42 = vsubps_avx(auVar52,auVar42);
  auVar204._0_4_ = fVar101 * auVar46._0_4_;
  auVar204._4_4_ = fVar101 * auVar46._4_4_;
  auVar204._8_4_ = fVar101 * auVar46._8_4_;
  auVar204._12_4_ = fVar101 * auVar46._12_4_;
  auVar150._4_4_ = auVar150._0_4_;
  auVar150._8_4_ = auVar150._0_4_;
  auVar150._12_4_ = auVar150._0_4_;
  auVar48 = vfmadd231ps_fma(auVar204,auVar150,auVar48);
  auVar163._0_4_ = fVar101 * auVar42._0_4_;
  auVar163._4_4_ = fVar101 * auVar42._4_4_;
  auVar163._8_4_ = fVar101 * auVar42._8_4_;
  auVar163._12_4_ = fVar101 * auVar42._12_4_;
  auVar46 = vfmadd231ps_fma(auVar163,auVar150,auVar46);
  auVar164._0_4_ = fVar101 * auVar46._0_4_;
  auVar164._4_4_ = fVar101 * auVar46._4_4_;
  auVar164._8_4_ = fVar101 * auVar46._8_4_;
  auVar164._12_4_ = fVar101 * auVar46._12_4_;
  auVar48 = vfmadd231ps_fma(auVar164,auVar150,auVar48);
  auVar16._8_4_ = 0x40400000;
  auVar16._0_8_ = 0x4040000040400000;
  auVar16._12_4_ = 0x40400000;
  auVar87._0_16_ = vmulps_avx512vl(auVar48,auVar16);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar25 = 1, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_01a02f5f;
    auVar140._0_4_ = fVar207 * (float)local_5f0._0_4_;
    auVar140._4_4_ = fVar207 * (float)local_5f0._4_4_;
    auVar140._8_4_ = fVar207 * fStack_5e8;
    auVar140._12_4_ = fVar207 * fStack_5e4;
    auVar128._4_4_ = fVar208;
    auVar128._0_4_ = fVar208;
    auVar128._8_4_ = fVar208;
    auVar128._12_4_ = fVar208;
    auVar48 = vfmadd132ps_fma(auVar128,auVar140,local_5e0);
    auVar123._4_4_ = fVar206;
    auVar123._0_4_ = fVar206;
    auVar123._8_4_ = fVar206;
    auVar123._12_4_ = fVar206;
    auVar48 = vfmadd132ps_fma(auVar123,auVar48,local_5d0);
    auVar115._4_4_ = fVar195;
    auVar115._0_4_ = fVar195;
    auVar115._8_4_ = fVar195;
    auVar115._12_4_ = fVar195;
    auVar42 = vfmadd132ps_fma(auVar115,auVar48,local_5c0);
    auVar48 = vshufps_avx(auVar42,auVar42,0xc9);
    auVar46 = vshufps_avx(auVar87._0_16_,auVar87._0_16_,0xc9);
    auVar116._0_4_ = auVar42._0_4_ * auVar46._0_4_;
    auVar116._4_4_ = auVar42._4_4_ * auVar46._4_4_;
    auVar116._8_4_ = auVar42._8_4_ * auVar46._8_4_;
    auVar116._12_4_ = auVar42._12_4_ * auVar46._12_4_;
    auVar48 = vfmsub231ps_fma(auVar116,auVar87._0_16_,auVar48);
    local_200 = vbroadcastss_avx512f(auVar40);
    auVar245 = vbroadcastss_avx512f(ZEXT416(1));
    local_1c0 = vpermps_avx512f(auVar245,ZEXT1664(auVar40));
    auVar245 = vpermps_avx512f(auVar245,ZEXT1664(auVar48));
    auVar100 = vbroadcastss_avx512f(ZEXT416(2));
    local_280 = vpermps_avx512f(auVar100,ZEXT1664(auVar48));
    local_240 = vbroadcastss_avx512f(auVar48);
    local_2c0[0] = (RTCHitN)auVar245[0];
    local_2c0[1] = (RTCHitN)auVar245[1];
    local_2c0[2] = (RTCHitN)auVar245[2];
    local_2c0[3] = (RTCHitN)auVar245[3];
    local_2c0[4] = (RTCHitN)auVar245[4];
    local_2c0[5] = (RTCHitN)auVar245[5];
    local_2c0[6] = (RTCHitN)auVar245[6];
    local_2c0[7] = (RTCHitN)auVar245[7];
    local_2c0[8] = (RTCHitN)auVar245[8];
    local_2c0[9] = (RTCHitN)auVar245[9];
    local_2c0[10] = (RTCHitN)auVar245[10];
    local_2c0[0xb] = (RTCHitN)auVar245[0xb];
    local_2c0[0xc] = (RTCHitN)auVar245[0xc];
    local_2c0[0xd] = (RTCHitN)auVar245[0xd];
    local_2c0[0xe] = (RTCHitN)auVar245[0xe];
    local_2c0[0xf] = (RTCHitN)auVar245[0xf];
    local_2c0[0x10] = (RTCHitN)auVar245[0x10];
    local_2c0[0x11] = (RTCHitN)auVar245[0x11];
    local_2c0[0x12] = (RTCHitN)auVar245[0x12];
    local_2c0[0x13] = (RTCHitN)auVar245[0x13];
    local_2c0[0x14] = (RTCHitN)auVar245[0x14];
    local_2c0[0x15] = (RTCHitN)auVar245[0x15];
    local_2c0[0x16] = (RTCHitN)auVar245[0x16];
    local_2c0[0x17] = (RTCHitN)auVar245[0x17];
    local_2c0[0x18] = (RTCHitN)auVar245[0x18];
    local_2c0[0x19] = (RTCHitN)auVar245[0x19];
    local_2c0[0x1a] = (RTCHitN)auVar245[0x1a];
    local_2c0[0x1b] = (RTCHitN)auVar245[0x1b];
    local_2c0[0x1c] = (RTCHitN)auVar245[0x1c];
    local_2c0[0x1d] = (RTCHitN)auVar245[0x1d];
    local_2c0[0x1e] = (RTCHitN)auVar245[0x1e];
    local_2c0[0x1f] = (RTCHitN)auVar245[0x1f];
    local_2c0[0x20] = (RTCHitN)auVar245[0x20];
    local_2c0[0x21] = (RTCHitN)auVar245[0x21];
    local_2c0[0x22] = (RTCHitN)auVar245[0x22];
    local_2c0[0x23] = (RTCHitN)auVar245[0x23];
    local_2c0[0x24] = (RTCHitN)auVar245[0x24];
    local_2c0[0x25] = (RTCHitN)auVar245[0x25];
    local_2c0[0x26] = (RTCHitN)auVar245[0x26];
    local_2c0[0x27] = (RTCHitN)auVar245[0x27];
    local_2c0[0x28] = (RTCHitN)auVar245[0x28];
    local_2c0[0x29] = (RTCHitN)auVar245[0x29];
    local_2c0[0x2a] = (RTCHitN)auVar245[0x2a];
    local_2c0[0x2b] = (RTCHitN)auVar245[0x2b];
    local_2c0[0x2c] = (RTCHitN)auVar245[0x2c];
    local_2c0[0x2d] = (RTCHitN)auVar245[0x2d];
    local_2c0[0x2e] = (RTCHitN)auVar245[0x2e];
    local_2c0[0x2f] = (RTCHitN)auVar245[0x2f];
    local_2c0[0x30] = (RTCHitN)auVar245[0x30];
    local_2c0[0x31] = (RTCHitN)auVar245[0x31];
    local_2c0[0x32] = (RTCHitN)auVar245[0x32];
    local_2c0[0x33] = (RTCHitN)auVar245[0x33];
    local_2c0[0x34] = (RTCHitN)auVar245[0x34];
    local_2c0[0x35] = (RTCHitN)auVar245[0x35];
    local_2c0[0x36] = (RTCHitN)auVar245[0x36];
    local_2c0[0x37] = (RTCHitN)auVar245[0x37];
    local_2c0[0x38] = (RTCHitN)auVar245[0x38];
    local_2c0[0x39] = (RTCHitN)auVar245[0x39];
    local_2c0[0x3a] = (RTCHitN)auVar245[0x3a];
    local_2c0[0x3b] = (RTCHitN)auVar245[0x3b];
    local_2c0[0x3c] = (RTCHitN)auVar245[0x3c];
    local_2c0[0x3d] = (RTCHitN)auVar245[0x3d];
    local_2c0[0x3e] = (RTCHitN)auVar245[0x3e];
    local_2c0[0x3f] = (RTCHitN)auVar245[0x3f];
    local_180 = local_300._0_8_;
    uStack_178 = local_300._8_8_;
    uStack_170 = local_300._16_8_;
    uStack_168 = local_300._24_8_;
    uStack_160 = local_300._32_8_;
    uStack_158 = local_300._40_8_;
    uStack_150 = local_300._48_8_;
    uStack_148 = local_300._56_8_;
    auVar245 = vmovdqa64_avx512f(local_340);
    local_140 = vmovdqa64_avx512f(auVar245);
    vpcmpeqd_avx2(auVar245._0_32_,auVar245._0_32_);
    local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
    local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
    *(float *)(ray + k * 4 + 0x200) = fVar205;
    auVar100 = vmovdqa64_avx512f(local_380);
    local_400 = vmovdqa64_avx512f(auVar100);
    local_620.valid = (int *)local_400;
    local_620.geometryUserPtr = pGVar8->userPtr;
    local_620.context = context->user;
    local_620.ray = (RTCRayN *)ray;
    local_620.hit = local_2c0;
    local_620.N = 0x10;
    if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar8->occlusionFilterN)(&local_620);
      auVar240 = ZEXT3264(_DAT_01fb9fe0);
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar239 = ZEXT1664(auVar40);
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar238 = ZEXT1664(auVar40);
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar236 = ZEXT1664(auVar40);
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar235 = ZEXT1664(auVar40);
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar106 = ZEXT1664(auVar40);
      auVar74 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar242 = ZEXT3264(auVar74);
      auVar74 = vbroadcastss_avx512vl(ZEXT416(1));
      auVar241 = ZEXT3264(auVar74);
      auVar100 = vmovdqa64_avx512f(local_400);
    }
    uVar12 = vptestmd_avx512f(auVar100,auVar100);
    auVar87._32_32_ = auVar100._32_32_;
    if ((short)uVar12 == 0) {
      auVar87._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar237 = ZEXT3264(auVar87._0_32_);
    }
    else {
      p_Var9 = context->args->filter;
      if (p_Var9 == (RTCFilterFunctionN)0x0) {
        auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar237 = ZEXT3264(auVar74);
      }
      else {
        auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar237 = ZEXT3264(auVar74);
        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
             RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
          (*p_Var9)(&local_620);
          auVar240 = ZEXT3264(_DAT_01fb9fe0);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar239 = ZEXT1664(auVar40);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
          auVar238 = ZEXT1664(auVar40);
          auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
          auVar237 = ZEXT3264(auVar74);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar236 = ZEXT1664(auVar40);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar235 = ZEXT1664(auVar40);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar106 = ZEXT1664(auVar40);
          auVar74 = vbroadcastss_avx512vl(ZEXT416(2));
          auVar242 = ZEXT3264(auVar74);
          auVar74 = vbroadcastss_avx512vl(ZEXT416(1));
          auVar241 = ZEXT3264(auVar74);
          auVar100 = vmovdqa64_avx512f(local_400);
        }
      }
      auVar245 = ZEXT464(0x3f800000);
      uVar32 = vptestmd_avx512f(auVar100,auVar100);
      auVar100 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      bVar38 = (bool)((byte)uVar32 & 1);
      auVar87._0_4_ =
           (uint)bVar38 * auVar100._0_4_ | (uint)!bVar38 * *(int *)(local_620.ray + 0x200);
      bVar38 = (bool)((byte)(uVar32 >> 1) & 1);
      auVar87._4_4_ =
           (uint)bVar38 * auVar100._4_4_ | (uint)!bVar38 * *(int *)(local_620.ray + 0x204);
      bVar38 = (bool)((byte)(uVar32 >> 2) & 1);
      auVar87._8_4_ =
           (uint)bVar38 * auVar100._8_4_ | (uint)!bVar38 * *(int *)(local_620.ray + 0x208);
      bVar38 = (bool)((byte)(uVar32 >> 3) & 1);
      auVar87._12_4_ =
           (uint)bVar38 * auVar100._12_4_ | (uint)!bVar38 * *(int *)(local_620.ray + 0x20c);
      bVar38 = (bool)((byte)(uVar32 >> 4) & 1);
      auVar87._16_4_ =
           (uint)bVar38 * auVar100._16_4_ | (uint)!bVar38 * *(int *)(local_620.ray + 0x210);
      bVar38 = (bool)((byte)(uVar32 >> 5) & 1);
      auVar87._20_4_ =
           (uint)bVar38 * auVar100._20_4_ | (uint)!bVar38 * *(int *)(local_620.ray + 0x214);
      bVar38 = (bool)((byte)(uVar32 >> 6) & 1);
      auVar87._24_4_ =
           (uint)bVar38 * auVar100._24_4_ | (uint)!bVar38 * *(int *)(local_620.ray + 0x218);
      bVar38 = (bool)((byte)(uVar32 >> 7) & 1);
      auVar87._28_4_ =
           (uint)bVar38 * auVar100._28_4_ | (uint)!bVar38 * *(int *)(local_620.ray + 0x21c);
      bVar38 = (bool)((byte)(uVar32 >> 8) & 1);
      auVar87._32_4_ =
           (uint)bVar38 * auVar100._32_4_ | (uint)!bVar38 * *(int *)(local_620.ray + 0x220);
      bVar38 = (bool)((byte)(uVar32 >> 9) & 1);
      auVar87._36_4_ =
           (uint)bVar38 * auVar100._36_4_ | (uint)!bVar38 * *(int *)(local_620.ray + 0x224);
      bVar38 = (bool)((byte)(uVar32 >> 10) & 1);
      auVar87._40_4_ =
           (uint)bVar38 * auVar100._40_4_ | (uint)!bVar38 * *(int *)(local_620.ray + 0x228);
      bVar38 = (bool)((byte)(uVar32 >> 0xb) & 1);
      auVar87._44_4_ =
           (uint)bVar38 * auVar100._44_4_ | (uint)!bVar38 * *(int *)(local_620.ray + 0x22c);
      bVar38 = (bool)((byte)(uVar32 >> 0xc) & 1);
      auVar87._48_4_ =
           (uint)bVar38 * auVar100._48_4_ | (uint)!bVar38 * *(int *)(local_620.ray + 0x230);
      bVar38 = (bool)((byte)(uVar32 >> 0xd) & 1);
      auVar87._52_4_ =
           (uint)bVar38 * auVar100._52_4_ | (uint)!bVar38 * *(int *)(local_620.ray + 0x234);
      bVar38 = (bool)((byte)(uVar32 >> 0xe) & 1);
      auVar87._56_4_ =
           (uint)bVar38 * auVar100._56_4_ | (uint)!bVar38 * *(int *)(local_620.ray + 0x238);
      bVar38 = SUB81(uVar32 >> 0xf,0);
      auVar87._60_4_ =
           (uint)bVar38 * auVar100._60_4_ | (uint)!bVar38 * *(int *)(local_620.ray + 0x23c);
      *(undefined1 (*) [64])(local_620.ray + 0x200) = auVar87;
      bVar25 = 1;
      if ((short)uVar32 != 0) goto LAB_01a02f5f;
    }
    auVar245 = ZEXT464(0x3f800000);
    *(float *)(ray + k * 4 + 0x200) = fVar209;
  }
  bVar25 = 0;
LAB_01a02f5f:
  bVar35 = (bool)(bVar35 | bVar25);
  goto LAB_01a020a0;
LAB_01a02f72:
  auVar42 = vinsertps_avx(auVar53,auVar54,0x10);
  goto LAB_01a01bbd;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }